

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  BBox3fa *pBVar1;
  Vec3fa *pVVar2;
  range<unsigned_long> *prVar3;
  atomic<unsigned_long> *paVar4;
  pointer *pppTVar5;
  ushort uVar6;
  ushort uVar7;
  ThreadLocal2 *pTVar8;
  ThreadLocal2 *pTVar9;
  size_t end;
  BBox1f *pBVar10;
  iterator iVar11;
  BBox1f *pBVar12;
  undefined1 auVar13 [16];
  int iVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  bool bVar28;
  SubGridBuildData *pSVar29;
  char cVar30;
  uint uVar31;
  undefined4 uVar32;
  size_t i;
  long lVar33;
  SetMB *this_00;
  BBox1f BVar34;
  void *pvVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  size_t sVar40;
  undefined8 *puVar41;
  runtime_error *prVar42;
  long lVar43;
  BBox1f BVar44;
  long lVar45;
  float *pfVar46;
  long *plVar47;
  ushort uVar48;
  size_t y_1;
  char *pcVar49;
  ulong uVar50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar51;
  long lVar52;
  ulong uVar53;
  ulong uVar54;
  long lVar55;
  int iVar56;
  undefined1 (*pauVar57) [16];
  ulong uVar58;
  ulong uVar59;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar60;
  Geometry *pGVar61;
  char *pcVar62;
  ushort uVar63;
  PrimRefMB *pPVar64;
  ulong uVar65;
  mvector<PrimRefMB> *prims;
  BuildRecord *in_00;
  bool bVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  uint uVar74;
  uint uVar93;
  uint uVar95;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  uint uVar94;
  uint uVar96;
  uint uVar97;
  uint uVar98;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar99;
  uint uVar100;
  uint uVar124;
  uint uVar125;
  __m128 afVar101;
  __m128 afVar102;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  uint uVar127;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  __m128 afVar128;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar131;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar141;
  undefined1 auVar142 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar150;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar151;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar152;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar153;
  float fVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  __m128 afVar158;
  __m128 afVar159;
  float fVar164;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar165;
  float fVar170;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar171;
  float fVar172;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar179;
  float fVar180;
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  vint4 ilower;
  vint4 iupper;
  uint primID [4];
  BBox3fa bounds0 [4];
  BBox3fa bounds1 [4];
  uint y [4];
  anon_class_1_0_00000001 reduction2;
  uint geomIDs [4];
  uint x [4];
  BuildRecordSplit current;
  NodeRecordMB4D values [16];
  AABBNode node0;
  task_group_context *in_stack_ffffffffffffe080;
  undefined1 local_1f70 [16];
  undefined1 local_1f60 [16];
  undefined1 local_1f20 [16];
  undefined1 local_1f10 [16];
  uint local_1ed0;
  BBox1f local_1eb8;
  undefined1 local_1eb0 [16];
  int local_1e94;
  ThreadLocal2 *local_1e90;
  NodeRecordMB4D *local_1e88;
  ThreadLocal2 *local_1e80;
  ulong local_1e78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e70;
  undefined1 local_1e60 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1e50;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1e40;
  BBox1f local_1e30;
  float local_1e28;
  float local_1e24;
  undefined1 local_1e20 [8];
  undefined8 uStack_1e18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e10;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1e00;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1df0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1de0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1dd0;
  size_t local_1dc0;
  size_t sStack_1db8;
  size_t local_1db0;
  size_t sStack_1da8;
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  undefined1 local_1d90 [8];
  undefined8 uStack_1d88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d70;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d40;
  unsigned_long local_1d30;
  size_t sStack_1d28;
  size_t local_1d20;
  size_t sStack_1d18;
  float local_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  undefined1 local_1d00 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cf0;
  undefined8 local_1ce0;
  ulong local_1cd0;
  char *local_1cc8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cc0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cb0;
  size_t local_1ca0;
  undefined8 uStack_1c98;
  undefined8 local_1c90;
  undefined8 uStack_1c88;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1c80;
  undefined8 local_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  size_t local_1c50;
  size_t sStack_1c48;
  size_t local_1c40;
  size_t sStack_1c38;
  BBox1f local_1c30;
  BBox1f BStack_1c28;
  BBox1f local_1c20;
  anon_class_1_0_00000001 *local_1c10;
  size_t sStack_1c08;
  size_t local_1c00;
  undefined8 local_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined1 local_1bd0 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bc0;
  undefined8 local_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 local_1b90;
  undefined8 uStack_1b88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b70;
  unsigned_long local_1b60;
  size_t sStack_1b58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b50;
  BBox1f local_1b40;
  BBox1f BStack_1b38;
  BBox1f local_1b30;
  undefined8 local_1b20;
  size_t sStack_1b18;
  size_t local_1b10;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 local_1af0;
  undefined8 uStack_1ae8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ae0;
  undefined8 local_1ad0;
  BBox1f *local_1ac8;
  SetMB *local_1ac0;
  size_t local_1ab8;
  ulong local_1ab0;
  ulong local_1aa8;
  PrimRefMB *local_1aa0;
  SubGridBuildData *local_1a98;
  ulong local_1a90;
  char *local_1a88;
  Geometry *local_1a80;
  anon_class_24_3_35f68c7c local_1a78;
  undefined1 local_1a60 [16];
  undefined1 local_1a50 [12];
  task_group_context_version tStack_1a44;
  context_traits cStack_1a43;
  undefined2 uStack_1a42;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a10;
  unsigned_long local_1a00;
  unsigned_long uStack_19f8;
  size_t local_19f0;
  size_t sStack_19e8;
  BBox1f local_19e0;
  BBox1f BStack_19d8;
  undefined4 local_19d0;
  undefined8 local_19cc;
  undefined4 local_19c4;
  undefined1 local_19c0 [16];
  undefined1 local_19b0 [16];
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_19a0;
  intrusive_list_node *local_1990;
  intrusive_list_node *piStack_1988;
  string_resource_index local_1970;
  ulong local_1930;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1920;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1910;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1900;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18f0;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 local_18d0;
  undefined8 uStack_18c8;
  ThreadLocal2 *local_18c0;
  ThreadLocal2 *pTStack_18b8;
  ThreadLocal2 *local_18b0;
  size_t sStack_18a8;
  BBox1f local_18a0;
  BBox1f BStack_1898;
  BBox1f local_1890;
  undefined8 *local_1880;
  undefined8 uStack_1878;
  size_t local_1870;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1860;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1850;
  ThreadLocal2 *local_1840;
  size_t sStack_1838;
  BBox1f local_1830;
  BBox1f BStack_1828;
  __m128 local_1820;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1810;
  __m128 local_1800;
  undefined1 local_17f0 [16];
  __m128 local_17e0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_17d0;
  undefined8 uStack_124c;
  undefined1 local_1240 [136];
  size_t sStack_11b8;
  BBox1f local_11b0;
  BBox1f BStack_11a8;
  float fStack_11a4;
  BBox1f local_11a0 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1190;
  size_t local_1180 [2];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1170;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1160;
  BBox1f *local_340 [16];
  ulong local_2c0;
  BBox1f local_2b8;
  BBox1f local_2b0 [63];
  long local_b8;
  undefined8 uVar126;
  
  local_1e50._8_8_ = local_1e50._0_8_;
  local_1e40._8_8_ = local_1e40._0_8_;
  local_1e60._8_8_ = local_1e60._0_8_;
  uVar37 = in->depth;
  local_1e88 = __return_storage_ptr__;
  if ((this->cfg).maxDepth < uVar37) {
    puVar41 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_1240._0_8_ = local_1240 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1240,"depth limit reached","");
    *puVar41 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar41 + 1) = 1;
    puVar41[2] = puVar41 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar41 + 2),local_1240._0_8_,
               (undefined1 *)(local_1240._0_8_ + local_1240._8_8_));
    __cxa_throw(puVar41,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  aVar103 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
            bounds0.lower.field_0;
  aVar143 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
            bounds0.upper.field_0;
  aVar151 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
            bounds1.lower.field_0;
  aVar25 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0;
  pBVar1 = &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds;
  uVar126 = *(undefined8 *)&(pBVar1->lower).field_0;
  uVar21 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    centBounds.lower.field_0 + 8);
  aVar26 = (pBVar1->lower).field_0;
  pVVar2 = &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
            upper;
  uVar22 = *(undefined8 *)&pVVar2->field_0;
  uVar23 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    centBounds.upper.field_0 + 8);
  aVar27 = pVVar2->field_0;
  prVar3 = &(in->prims).super_PrimInfoMB.object_range;
  pTVar8 = (ThreadLocal2 *)prVar3->_begin;
  pTVar9 = (ThreadLocal2 *)(in->prims).super_PrimInfoMB.object_range._end;
  local_1830 = (in->prims).super_PrimInfoMB.max_time_range;
  BStack_1828 = (in->prims).super_PrimInfoMB.time_range;
  local_1840 = (ThreadLocal2 *)(in->prims).super_PrimInfoMB.num_time_segments;
  sStack_1838 = (in->prims).super_PrimInfoMB.max_num_time_segments;
  local_1d00._8_8_ = local_1d00._0_8_;
  local_1d00._0_8_ = in;
  BVar44 = (BBox1f)(in->prims).prims;
  findFallback((Split *)local_1240,this,&in->prims);
  local_1160 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)local_1240._48_16_;
  local_1170 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)local_1240._32_16_;
  local_1190._0_8_ = local_1240._0_8_;
  local_1930 = uVar37;
  local_1920 = aVar103;
  local_1910 = aVar143;
  local_1900 = aVar151;
  local_18f0 = aVar25;
  local_18e0 = uVar126;
  uStack_18d8 = uVar21;
  local_18d0 = uVar22;
  uStack_18c8 = uVar23;
  local_18c0 = pTVar8;
  pTStack_18b8 = pTVar9;
  local_18b0 = local_1840;
  sStack_18a8 = sStack_1838;
  local_18a0 = local_1830;
  BStack_1898 = BStack_1828;
  BVar34 = BStack_1898;
  local_1890 = BVar44;
  local_1880 = (undefined8 *)local_1240._0_8_;
  uStack_1878 = local_1240._8_8_;
  local_1180[0] = local_1240._16_8_;
  local_1870 = local_1240._16_8_;
  local_1860 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)local_1240._32_16_;
  local_1850 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)local_1240._48_16_;
  local_1e78 = (long)pTVar9 - (long)pTVar8;
  if (local_1e78 == 0 || uVar37 != 1) {
    bVar28 = false;
  }
  else {
    BStack_1898.lower = BStack_1828.lower;
    BStack_1898.upper = BStack_1828.upper;
    lVar43 = (long)pTVar9 - (long)pTVar8;
    if (pTVar9 < pTVar8 || lVar43 == 0) {
      fVar165 = INFINITY;
      fVar172 = -INFINITY;
    }
    else {
      pfVar46 = &(*(PrimRefMB **)((long)BVar44 + 0x20))[(long)pTVar8].time_range.upper;
      auVar78._0_12_ = ZEXT812(0x7f800000);
      auVar78._12_4_ = 0;
      fVar171 = -INFINITY;
      do {
        if (((BBox1f *)(pfVar46 + -1))->lower <= auVar78._0_4_) {
          auVar78._0_4_ = ((BBox1f *)(pfVar46 + -1))->lower;
        }
        fVar165 = auVar78._0_4_;
        fVar172 = *pfVar46;
        if (*pfVar46 <= fVar171) {
          fVar172 = fVar171;
        }
        pfVar46 = pfVar46 + 0x14;
        lVar43 = lVar43 + -1;
        fVar171 = fVar172;
      } while (lVar43 != 0);
    }
    bVar28 = BStack_1898.lower < fVar165 || fVar172 < BStack_1898.upper;
  }
  local_1e90 = pTVar8;
  local_1e80 = pTVar9;
  BStack_1898 = BVar34;
  if (((local_1e78 <= (this->cfg).maxLeafSize) &&
      (uStack_1878._4_4_ = SUB84(local_1240._8_8_,4), uStack_1878._4_4_ < 2)) && (!bVar28)) {
    pPVar64 = *(PrimRefMB **)((long)BVar44 + 0x20);
    local_1a50._0_4_ = pPVar64[(long)pTVar8].lbounds.bounds0.lower.field_0.m128[3];
    uVar31 = 1;
    if (1 < local_1e78) {
      uVar37 = 1;
      do {
        fVar172 = pPVar64[(long)&(pTVar8->mutex).mutex + uVar37].lbounds.bounds0.lower.field_0.m128
                  [3];
        uVar36 = (ulong)uVar31;
        if (uVar31 != 0) {
          uVar65 = 0;
          do {
            if (fVar172 == *(float *)(local_1a50 + uVar65 * 4)) goto LAB_00c95070;
            uVar65 = uVar65 + 1;
          } while (uVar36 != uVar65);
        }
        uVar31 = uVar31 + 1;
        *(float *)(local_1a50 + uVar36 * 4) = fVar172;
LAB_00c95070:
        uVar37 = uVar37 + 1;
      } while (uVar37 != local_1e78);
    }
    local_1cd0 = (ulong)uVar31;
    local_1bd0._0_8_ = (undefined8 *)((ulong)uVar31 * 0x90);
    pTVar9 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar9->alloc)._M_b._M_p) {
      sStack_1838 = CONCAT71(sStack_1838._1_7_,1);
      local_1840 = pTVar9;
      MutexSys::lock(&pTVar9->mutex);
      if ((pTVar9->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar4 = &((pTVar9->alloc)._M_b._M_p)->bytesUsed;
        (paVar4->super___atomic_base<unsigned_long>)._M_i =
             (paVar4->super___atomic_base<unsigned_long>)._M_i +
             (pTVar9->alloc1).bytesUsed + (pTVar9->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar4 = &((pTVar9->alloc)._M_b._M_p)->bytesFree;
        (paVar4->super___atomic_base<unsigned_long>)._M_i =
             (paVar4->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar9->alloc0).end + (pTVar9->alloc1).end) -
             ((pTVar9->alloc0).cur + (pTVar9->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar4 = &((pTVar9->alloc)._M_b._M_p)->bytesWasted;
        (paVar4->super___atomic_base<unsigned_long>)._M_i =
             (paVar4->super___atomic_base<unsigned_long>)._M_i +
             (pTVar9->alloc1).bytesWasted + (pTVar9->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar9->alloc0).bytesUsed = 0;
      (pTVar9->alloc0).bytesWasted = 0;
      (pTVar9->alloc0).end = 0;
      (pTVar9->alloc0).allocBlockSize = 0;
      (pTVar9->alloc0).ptr = (char *)0x0;
      (pTVar9->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar9->alloc1).bytesUsed = 0;
        (pTVar9->alloc1).bytesWasted = 0;
        (pTVar9->alloc1).end = 0;
        (pTVar9->alloc1).allocBlockSize = 0;
        (pTVar9->alloc1).ptr = (char *)0x0;
        (pTVar9->alloc1).cur = 0;
      }
      else {
        (pTVar9->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar9->alloc1).ptr = (char *)0x0;
        (pTVar9->alloc1).cur = 0;
        (pTVar9->alloc1).end = 0;
        (pTVar9->alloc1).allocBlockSize = 0;
        (pTVar9->alloc1).bytesUsed = 0;
        (pTVar9->alloc1).bytesWasted = 0;
        (pTVar9->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar9->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      local_1240._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      local_1240[8] = 1;
      local_1cc0._0_8_ = pTVar9;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar11._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)&local_1cc0);
      }
      else {
        *iVar11._M_current = (ThreadLocal2 *)local_1cc0._0_8_;
        pppTVar5 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar5 = *pppTVar5 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if ((char)sStack_1838 == '\x01') {
        MutexSys::unlock(&local_1840->mutex);
      }
    }
    (alloc.talloc1)->bytesUsed = local_1bd0._0_8_ + (alloc.talloc1)->bytesUsed;
    sVar40 = (alloc.talloc1)->cur;
    uVar37 = (ulong)(-(int)sVar40 & 0xf);
    uVar36 = local_1bd0._0_8_ + uVar37 + sVar40;
    (alloc.talloc1)->cur = uVar36;
    if ((alloc.talloc1)->end < uVar36) {
      (alloc.talloc1)->cur = sVar40;
      if ((undefined8 *)(alloc.talloc1)->allocBlockSize < (undefined8 *)(local_1bd0._0_8_ << 2)) {
        pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1bd0);
      }
      else {
        local_1240._0_8_ = (undefined8 *)(alloc.talloc1)->allocBlockSize;
        pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1240);
        (alloc.talloc1)->ptr = pcVar49;
        sVar40 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar40;
        (alloc.talloc1)->end = local_1240._0_8_;
        (alloc.talloc1)->cur = local_1bd0._0_8_;
        if ((ulong)local_1240._0_8_ < (ulong)local_1bd0._0_8_) {
          (alloc.talloc1)->cur = 0;
          local_1240._0_8_ = (alloc.talloc1)->allocBlockSize;
          pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1240);
          (alloc.talloc1)->ptr = pcVar49;
          sVar40 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar40;
          (alloc.talloc1)->end = local_1240._0_8_;
          (alloc.talloc1)->cur = local_1bd0._0_8_;
          if ((ulong)local_1240._0_8_ < (ulong)local_1bd0._0_8_) {
            (alloc.talloc1)->cur = 0;
            pcVar49 = (char *)0x0;
            goto LAB_00c95c28;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar40;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar37;
      pcVar49 = (alloc.talloc1)->ptr + (uVar36 - local_1bd0._0_8_);
    }
LAB_00c95c28:
    uVar37 = 7;
    if (local_1cd0 < 7) {
      uVar37 = local_1cd0;
    }
    local_1ab8 = uVar37 | (ulong)pcVar49 | 8;
    if (local_1cd0 == 0) {
      local_1e60._8_8_ = 0x7f8000007f800000;
      local_1e60._0_8_ = 0x7f8000007f800000;
      local_1d00._8_8_ = 0x7f8000007f800000;
      local_1d00._0_8_ = 0x7f8000007f800000;
      local_1e40._8_8_ = 0xff800000ff800000;
      local_1e40._0_8_ = 0xff800000ff800000;
      local_1e50._8_8_ = 0xff800000ff800000;
      local_1e50._0_8_ = 0xff800000ff800000;
    }
    else {
      pPVar64 = pPVar64 + (long)pTVar8;
      local_1cc8 = pcVar49;
      uVar37 = 0;
      local_1e50.v = _DAT_01f7aa00;
      local_1d00._0_4_ = _DAT_01f7a9f0;
      local_1d00._4_4_ = _UNK_01f7a9f4;
      local_1d00._8_4_ = _UNK_01f7a9f8;
      local_1d00._12_4_ = _UNK_01f7a9fc;
      local_1e40.v = _DAT_01f7aa00;
      local_1e60._0_4_ = _DAT_01f7a9f0;
      local_1e60._4_4_ = _UNK_01f7a9f4;
      local_1e60._8_4_ = _UNK_01f7a9f8;
      local_1e60._12_4_ = _UNK_01f7a9fc;
      local_1aa0 = pPVar64;
      aVar75 = _DAT_01f7aa00;
      do {
        uVar31 = *(uint *)(local_1a50 + uVar37 * 4);
        uVar36 = (ulong)uVar31;
        afVar102 = _DAT_01f7a9f0;
        fVar172 = BStack_1898.upper;
        fVar165 = BStack_1898.lower;
        if (local_1e80 == local_1e90) {
          uVar53 = 0;
        }
        else {
          local_1ab0 = uVar37;
          pGVar61 = (((this->createLeaf).scene)->geometries).items[uVar36].ptr;
          local_1a98 = (this->createLeaf).sgrids;
          uVar65 = 0;
          uVar53 = 0;
          local_1a88 = pcVar49;
          local_1a90 = uVar36;
          local_1e24 = BStack_1898.lower;
          local_1e28 = BStack_1898.upper;
          local_1a80 = pGVar61;
          do {
            pSVar29 = local_1a98;
            if (pPVar64[uVar65].lbounds.bounds0.lower.field_0.m128[3] == (float)uVar36) {
              fVar171 = pPVar64[uVar65].lbounds.bounds0.upper.field_0.m128[3];
              uVar6 = local_1a98[(uint)fVar171].sx;
              *(uint *)(local_19b0 + uVar53 * 4) = (uint)uVar6;
              uVar48 = local_1a98[(uint)fVar171].sy;
              (&local_1ae0.field_1.x)[uVar53] = (float)(uint)uVar48;
              uVar31 = pSVar29[(uint)fVar171].primID;
              *(uint *)((long)&local_1cf0 + uVar53 * 4) = uVar31;
              uVar36 = (ulong)uVar6 & 0x7fff;
              uVar37 = (ulong)uVar48 & 0x7fff;
              lVar43 = *(long *)&pGVar61->field_0x58;
              lVar33 = (ulong)uVar31 *
                       pGVar61[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
              fVar171 = pGVar61->fnumTimeSegments;
              fVar177 = (pGVar61->time_range).lower;
              fVar175 = (pGVar61->time_range).upper - fVar177;
              fVar176 = (fVar165 - fVar177) / fVar175;
              fVar175 = (fVar172 - fVar177) / fVar175;
              local_19c0 = ZEXT416((uint)(fVar171 * fVar176));
              local_1eb0._0_4_ = fVar171 * fVar175;
              fVar165 = floorf(fVar171 * fVar176);
              fVar172 = ceilf((float)local_1eb0._0_4_);
              iVar56 = (int)fVar165;
              if (fVar165 <= 0.0) {
                fVar165 = 0.0;
              }
              if (iVar56 < 0) {
                iVar56 = -1;
              }
              iVar14 = (int)fVar171 + 1;
              if ((int)fVar172 < (int)fVar171 + 1) {
                iVar14 = (int)fVar172;
              }
              if (fVar171 <= fVar172) {
                fVar172 = fVar171;
              }
              uVar6 = *(ushort *)(lVar43 + 10 + lVar33);
              uVar58 = (ulong)uVar6;
              if (uVar37 + 3 < (ulong)uVar6) {
                uVar58 = uVar37 + 3;
              }
              uVar48 = (ushort)uVar37;
              uVar63 = (ushort)uVar36;
              afVar102 = _DAT_01f7a9f0;
              afVar101 = _DAT_01f7a9f0;
              aVar75 = _DAT_01f7aa00;
              aVar132 = _DAT_01f7aa00;
              aVar153 = _DAT_01f7aa00;
              afVar159 = _DAT_01f7a9f0;
              aVar152 = _DAT_01f7aa00;
              afVar158 = _DAT_01f7a9f0;
              if (uVar48 < uVar6) {
                local_1aa8 = uVar36 + 3;
                uVar7 = *(ushort *)(lVar43 + 8 + lVar33);
                uVar59 = (ulong)uVar7;
                if (local_1aa8 < uVar7) {
                  uVar59 = local_1aa8;
                }
                uVar50 = uVar37;
                do {
                  if (uVar63 < uVar7) {
                    lVar52 = (long)(int)fVar165 * 0x38;
                    lVar55 = *(long *)(*(long *)&pGVar61[2].numPrimitives + 0x10 + lVar52);
                    uVar38 = *(uint *)(lVar43 + 4 + lVar33) * uVar50;
                    pauVar57 = (undefined1 (*) [16])
                               ((*(uint *)(lVar43 + lVar33) + uVar36 + uVar38) * lVar55 +
                               *(long *)(*(long *)&pGVar61[2].numPrimitives + lVar52));
                    lVar52 = uVar59 - uVar36;
                    do {
                      auVar78 = *pauVar57;
                      auVar142._0_4_ =
                           -(uint)(auVar78._0_4_ < 1.844e+18 && -1.844e+18 < auVar78._0_4_);
                      auVar142._4_4_ =
                           -(uint)(auVar78._4_4_ < 1.844e+18 && -1.844e+18 < auVar78._4_4_);
                      auVar142._8_4_ =
                           -(uint)(auVar78._8_4_ < 1.844e+18 && -1.844e+18 < auVar78._8_4_);
                      auVar142._12_4_ =
                           -(uint)(auVar78._12_4_ < 1.844e+18 && -1.844e+18 < auVar78._12_4_);
                      uVar32 = movmskps((int)uVar38,auVar142);
                      uVar38 = (ulong)CONCAT31((int3)((uint)uVar32 >> 8),~(byte)uVar32);
                      afVar102 = _DAT_01f7a9f0;
                      aVar75 = _DAT_01f7aa00;
                      if ((~(byte)uVar32 & 7) != 0) goto LAB_00c95fc5;
                      afVar101 = (__m128)minps((undefined1  [16])afVar101,auVar78);
                      aVar132.v = (__m128)maxps(aVar132.v,auVar78);
                      pauVar57 = (undefined1 (*) [16])(*pauVar57 + lVar55);
                      lVar52 = lVar52 + -1;
                    } while (lVar52 != 0);
                  }
                  uVar50 = uVar50 + 1;
                  afVar102 = afVar101;
                  aVar75 = aVar132;
                } while (uVar50 != uVar58);
LAB_00c95fc5:
                lVar55 = (long)(int)fVar172 * 0x38;
                uVar50 = uVar37;
                afVar128 = _DAT_01f7a9f0;
                aVar141 = _DAT_01f7aa00;
                do {
                  if (uVar63 < uVar7) {
                    lVar52 = *(long *)(*(long *)&pGVar61[2].numPrimitives + 0x10 + lVar55);
                    uVar38 = *(uint *)(lVar43 + 4 + lVar33) * uVar50;
                    pauVar57 = (undefined1 (*) [16])
                               ((*(uint *)(lVar43 + lVar33) + uVar36 + uVar38) * lVar52 +
                               *(long *)(*(long *)&pGVar61[2].numPrimitives + lVar55));
                    lVar45 = uVar59 - uVar36;
                    do {
                      auVar78 = *pauVar57;
                      auVar157._0_4_ =
                           -(uint)(auVar78._0_4_ < 1.844e+18 && -1.844e+18 < auVar78._0_4_);
                      auVar157._4_4_ =
                           -(uint)(auVar78._4_4_ < 1.844e+18 && -1.844e+18 < auVar78._4_4_);
                      auVar157._8_4_ =
                           -(uint)(auVar78._8_4_ < 1.844e+18 && -1.844e+18 < auVar78._8_4_);
                      auVar157._12_4_ =
                           -(uint)(auVar78._12_4_ < 1.844e+18 && -1.844e+18 < auVar78._12_4_);
                      uVar32 = movmskps((int)uVar38,auVar157);
                      uVar38 = (ulong)CONCAT31((int3)((uint)uVar32 >> 8),~(byte)uVar32);
                      afVar101 = _DAT_01f7a9f0;
                      aVar132 = _DAT_01f7aa00;
                      if ((~(byte)uVar32 & 7) != 0) goto LAB_00c9604c;
                      afVar128 = (__m128)minps((undefined1  [16])afVar128,auVar78);
                      aVar141.v = (__m128)maxps(aVar141.v,auVar78);
                      pauVar57 = (undefined1 (*) [16])(*pauVar57 + lVar52);
                      lVar45 = lVar45 + -1;
                    } while (lVar45 != 0);
                  }
                  uVar50 = uVar50 + 1;
                  afVar101 = afVar128;
                  aVar132 = aVar141;
                } while (uVar50 != uVar58);
LAB_00c9604c:
                local_1e94 = iVar56;
                if (iVar14 - iVar56 != 1) {
                  if (uVar48 < uVar6) {
                    uVar7 = *(ushort *)(lVar43 + 8 + lVar33);
                    uVar59 = (ulong)uVar7;
                    if (local_1aa8 < uVar7) {
                      uVar59 = local_1aa8;
                    }
                    uVar50 = uVar37;
                    do {
                      uVar38 = uVar37;
                      aVar141 = _DAT_01f7aa00;
                      afVar128 = _DAT_01f7a9f0;
                      if (uVar63 < uVar7) {
                        lVar45 = (long)(int)fVar165 * 0x38;
                        lVar52 = *(long *)(*(long *)&pGVar61[2].numPrimitives + 0x48 + lVar45);
                        uVar39 = *(uint *)(lVar43 + 4 + lVar33) * uVar50;
                        pauVar57 = (undefined1 (*) [16])
                                   ((*(uint *)(lVar43 + lVar33) + uVar36 + uVar39) * lVar52 +
                                   *(long *)(*(long *)&pGVar61[2].numPrimitives + 0x38 + lVar45));
                        lVar45 = uVar59 - uVar36;
                        do {
                          auVar78 = *pauVar57;
                          auVar168._0_4_ =
                               -(uint)(auVar78._0_4_ < 1.844e+18 && -1.844e+18 < auVar78._0_4_);
                          auVar168._4_4_ =
                               -(uint)(auVar78._4_4_ < 1.844e+18 && -1.844e+18 < auVar78._4_4_);
                          auVar168._8_4_ =
                               -(uint)(auVar78._8_4_ < 1.844e+18 && -1.844e+18 < auVar78._8_4_);
                          auVar168._12_4_ =
                               -(uint)(auVar78._12_4_ < 1.844e+18 && -1.844e+18 < auVar78._12_4_);
                          uVar32 = movmskps((int)uVar39,auVar168);
                          uVar39 = (ulong)CONCAT31((int3)((uint)uVar32 >> 8),~(byte)uVar32);
                          afVar159 = _DAT_01f7a9f0;
                          aVar153 = _DAT_01f7aa00;
                          pGVar61 = local_1a80;
                          if ((~(byte)uVar32 & 7) != 0) goto LAB_00c961da;
                          afVar158 = (__m128)minps((undefined1  [16])afVar158,auVar78);
                          aVar152.v = (__m128)maxps(aVar152.v,auVar78);
                          pauVar57 = (undefined1 (*) [16])(*pauVar57 + lVar52);
                          lVar45 = lVar45 + -1;
                        } while (lVar45 != 0);
                      }
                      uVar50 = uVar50 + 1;
                      afVar159 = afVar158;
                      aVar153 = aVar152;
                    } while (uVar50 != uVar58);
LAB_00c961da:
                    do {
                      if (uVar63 < uVar7) {
                        lVar52 = *(long *)(*(long *)&pGVar61[2].numPrimitives + -0x28 + lVar55);
                        uVar50 = *(uint *)(lVar43 + 4 + lVar33) * uVar38;
                        pauVar57 = (undefined1 (*) [16])
                                   ((*(uint *)(lVar43 + lVar33) + uVar36 + uVar50) * lVar52 +
                                   *(long *)(*(long *)&pGVar61[2].numPrimitives + -0x38 + lVar55));
                        lVar45 = uVar59 - uVar36;
                        do {
                          auVar78 = *pauVar57;
                          auVar13._4_4_ =
                               -(uint)(auVar78._4_4_ < 1.844e+18 && -1.844e+18 < auVar78._4_4_);
                          auVar13._0_4_ =
                               -(uint)(auVar78._0_4_ < 1.844e+18 && -1.844e+18 < auVar78._0_4_);
                          auVar13._8_4_ =
                               -(uint)(auVar78._8_4_ < 1.844e+18 && -1.844e+18 < auVar78._8_4_);
                          auVar13._12_4_ =
                               -(uint)(auVar78._12_4_ < 1.844e+18 && -1.844e+18 < auVar78._12_4_);
                          uVar32 = movmskps((int)uVar50,auVar13);
                          uVar50 = (ulong)CONCAT31((int3)((uint)uVar32 >> 8),~(byte)uVar32);
                          aVar152 = _DAT_01f7aa00;
                          afVar158 = _DAT_01f7a9f0;
                          if ((~(byte)uVar32 & 7) != 0) goto LAB_00c96271;
                          afVar128 = (__m128)minps((undefined1  [16])afVar128,auVar78);
                          aVar141.v = (__m128)maxps(aVar141.v,auVar78);
                          pauVar57 = (undefined1 (*) [16])(*pauVar57 + lVar52);
                          lVar45 = lVar45 + -1;
                        } while (lVar45 != 0);
                      }
                      uVar38 = uVar38 + 1;
                      aVar152 = aVar141;
                      afVar158 = afVar128;
                    } while (uVar38 != uVar58);
                  }
                  goto LAB_00c96271;
                }
LAB_00c96062:
                fVar171 = (float)local_19c0._0_4_ - fVar165;
                if ((float)local_19c0._0_4_ - fVar165 <= 0.0) {
                  fVar171 = 0.0;
                }
                fVar177 = 1.0 - fVar171;
                aVar103.m128[1] = fVar177 * afVar102[1] + fVar171 * afVar101[1];
                aVar103.m128[0] = fVar177 * afVar102[0] + fVar171 * afVar101[0];
                aVar143._0_4_ = fVar177 * aVar75.v[0] + fVar171 * aVar132.v[0];
                aVar143._4_4_ = fVar177 * aVar75.v[1] + fVar171 * aVar132.v[1];
                aVar143._8_4_ = fVar177 * aVar75.v[2] + fVar171 * aVar132.v[2];
                aVar143._12_4_ = fVar177 * aVar75.v[3] + fVar171 * aVar132.v[3];
                fVar165 = fVar172 - (float)local_1eb0._0_4_;
                if (fVar172 - (float)local_1eb0._0_4_ <= 0.0) {
                  fVar165 = 0.0;
                }
                fVar172 = 1.0 - fVar165;
                auVar129._0_4_ = afVar101[0] * fVar172 + afVar102[0] * fVar165;
                auVar129._4_4_ = afVar101[1] * fVar172 + afVar102[1] * fVar165;
                auVar129._8_4_ = afVar101[2] * fVar172 + afVar102[2] * fVar165;
                auVar129._12_4_ = afVar101[3] * fVar172 + afVar102[3] * fVar165;
                aVar151._0_4_ = fVar172 * aVar132.v[0] + fVar165 * aVar75.v[0];
                aVar151._4_4_ = fVar172 * aVar132.v[1] + fVar165 * aVar75.v[1];
                aVar151._8_4_ = fVar172 * aVar132.v[2] + fVar165 * aVar75.v[2];
                aVar151._12_4_ = fVar172 * aVar132.v[3] + fVar165 * aVar75.v[3];
                aVar103.m128[2] = fVar177 * afVar102[2] + fVar171 * afVar101[2];
                aVar103.m128[3] = fVar177 * afVar102[3] + fVar171 * afVar101[3];
              }
              else {
                if (iVar14 - iVar56 == 1) goto LAB_00c96062;
LAB_00c96271:
                fVar177 = (float)local_19c0._0_4_ - fVar165;
                if ((float)local_19c0._0_4_ - fVar165 <= 0.0) {
                  fVar177 = 0.0;
                }
                fVar165 = 1.0 - fVar177;
                aVar103.m128[0] = afVar102[0] * fVar165 + afVar159[0] * fVar177;
                aVar103.m128[1] = afVar102[1] * fVar165 + afVar159[1] * fVar177;
                aVar103.m128[2] = afVar102[2] * fVar165 + afVar159[2] * fVar177;
                aVar103.m128[3] = afVar102[3] * fVar165 + afVar159[3] * fVar177;
                aVar143._0_4_ = fVar165 * aVar75.v[0] + fVar177 * aVar153.v[0];
                aVar143._4_4_ = fVar165 * aVar75.v[1] + fVar177 * aVar153.v[1];
                aVar143._8_4_ = fVar165 * aVar75.v[2] + fVar177 * aVar153.v[2];
                aVar143._12_4_ = fVar165 * aVar75.v[3] + fVar177 * aVar153.v[3];
                fVar165 = fVar172 - (float)local_1eb0._0_4_;
                if (fVar172 - (float)local_1eb0._0_4_ <= 0.0) {
                  fVar165 = 0.0;
                }
                fVar172 = 1.0 - fVar165;
                auVar129._0_4_ = afVar101[0] * fVar172 + afVar158[0] * fVar165;
                auVar129._4_4_ = afVar101[1] * fVar172 + afVar158[1] * fVar165;
                auVar129._8_4_ = afVar101[2] * fVar172 + afVar158[2] * fVar165;
                auVar129._12_4_ = afVar101[3] * fVar172 + afVar158[3] * fVar165;
                aVar151._0_4_ = fVar172 * aVar132.v[0] + fVar165 * aVar152.v[0];
                aVar151._4_4_ = fVar172 * aVar132.v[1] + fVar165 * aVar152.v[1];
                aVar151._8_4_ = fVar172 * aVar132.v[2] + fVar165 * aVar152.v[2];
                aVar151._12_4_ = fVar172 * aVar132.v[3] + fVar165 * aVar152.v[3];
                if ((int)(iVar56 + 1U) < iVar14) {
                  uVar59 = uVar36 + 3;
                  local_1eb0._0_8_ = uVar59;
                  uVar50 = (ulong)(iVar56 + 1U);
                  do {
                    aVar75 = _DAT_01f7aa00;
                    afVar102 = _DAT_01f7a9f0;
                    if (uVar48 < uVar6) {
                      uVar7 = *(ushort *)(lVar43 + 8 + lVar33);
                      uVar38 = (ulong)uVar7;
                      if (uVar59 < uVar7) {
                        uVar38 = uVar59;
                      }
                      uVar39 = uVar37;
                      aVar132 = _DAT_01f7aa00;
                      afVar101 = _DAT_01f7a9f0;
                      do {
                        if (uVar63 < uVar7) {
                          uVar54 = uVar50 * 0x38;
                          lVar55 = *(long *)(*(long *)&pGVar61[2].numPrimitives + 0x10 + uVar54);
                          pauVar57 = (undefined1 (*) [16])
                                     ((*(uint *)(lVar43 + lVar33) + uVar36 +
                                      *(uint *)(lVar43 + 4 + lVar33) * uVar39) * lVar55 +
                                     *(long *)(*(long *)&pGVar61[2].numPrimitives + uVar54));
                          lVar52 = uVar38 - uVar36;
                          do {
                            auVar78 = *pauVar57;
                            auVar162._0_4_ =
                                 -(uint)(auVar78._0_4_ < 1.844e+18 && -1.844e+18 < auVar78._0_4_);
                            auVar162._4_4_ =
                                 -(uint)(auVar78._4_4_ < 1.844e+18 && -1.844e+18 < auVar78._4_4_);
                            auVar162._8_4_ =
                                 -(uint)(auVar78._8_4_ < 1.844e+18 && -1.844e+18 < auVar78._8_4_);
                            auVar162._12_4_ =
                                 -(uint)(auVar78._12_4_ < 1.844e+18 && -1.844e+18 < auVar78._12_4_);
                            uVar32 = movmskps((int)uVar54,auVar162);
                            uVar54 = (ulong)CONCAT31((int3)((uint)uVar32 >> 8),~(byte)uVar32);
                            aVar75 = _DAT_01f7aa00;
                            afVar102 = _DAT_01f7a9f0;
                            if ((~(byte)uVar32 & 7) != 0) goto LAB_00c963eb;
                            afVar101 = (__m128)minps((undefined1  [16])afVar101,auVar78);
                            aVar132.v = (__m128)maxps(aVar132.v,auVar78);
                            pauVar57 = (undefined1 (*) [16])(*pauVar57 + lVar55);
                            lVar52 = lVar52 + -1;
                          } while (lVar52 != 0);
                        }
                        uVar39 = uVar39 + 1;
                        aVar75 = aVar132;
                        afVar102 = afVar101;
                      } while (uVar39 != uVar58);
                    }
LAB_00c963eb:
                    fVar180 = ((float)(int)uVar50 / fVar171 - fVar176) / (fVar175 - fVar176);
                    fVar154 = 1.0 - fVar180;
                    fVar177 = auVar129._4_4_;
                    fVar179 = auVar129._12_4_;
                    fVar164 = auVar129._8_4_;
                    fVar172 = aVar103.m128[1];
                    fVar165 = aVar103.m128[3];
                    fVar170 = aVar103.m128[2];
                    auVar133._0_4_ =
                         afVar102[0] - (aVar103.m128[0] * fVar154 + auVar129._0_4_ * fVar180);
                    auVar133._4_4_ = afVar102[1] - (fVar172 * fVar154 + fVar177 * fVar180);
                    auVar133._8_4_ = afVar102[2] - (fVar170 * fVar154 + fVar164 * fVar180);
                    auVar133._12_4_ = afVar102[3] - (fVar165 * fVar154 + fVar179 * fVar180);
                    fVar73 = aVar151.m128[1];
                    fVar131 = aVar151.m128[2];
                    fVar150 = aVar151.m128[3];
                    fVar99 = aVar143.m128[1];
                    fVar71 = aVar143.m128[2];
                    fVar72 = aVar143.m128[3];
                    auVar76._0_4_ =
                         aVar75.v[0] - (fVar154 * aVar143.m128[0] + fVar180 * aVar151.m128[0]);
                    auVar76._4_4_ = aVar75.v[1] - (fVar154 * fVar99 + fVar180 * fVar73);
                    auVar76._8_4_ = aVar75.v[2] - (fVar154 * fVar71 + fVar180 * fVar131);
                    auVar76._12_4_ = aVar75.v[3] - (fVar154 * fVar72 + fVar180 * fVar150);
                    auVar169 = minps(auVar133,ZEXT816(0));
                    auVar78 = maxps(auVar76,ZEXT816(0));
                    aVar103.m128[0] = aVar103.m128[0] + auVar169._0_4_;
                    aVar103.m128[1] = fVar172 + auVar169._4_4_;
                    aVar103.m128[2] = fVar170 + auVar169._8_4_;
                    aVar103.m128[3] = fVar165 + auVar169._12_4_;
                    auVar129._0_4_ = auVar129._0_4_ + auVar169._0_4_;
                    auVar129._4_4_ = fVar177 + auVar169._4_4_;
                    auVar129._8_4_ = fVar164 + auVar169._8_4_;
                    auVar129._12_4_ = fVar179 + auVar169._12_4_;
                    aVar143._0_4_ = aVar143.m128[0] + auVar78._0_4_;
                    aVar143._4_4_ = fVar99 + auVar78._4_4_;
                    aVar143._8_4_ = fVar71 + auVar78._8_4_;
                    aVar143._12_4_ = fVar72 + auVar78._12_4_;
                    aVar151._0_4_ = aVar151.m128[0] + auVar78._0_4_;
                    aVar151._4_4_ = fVar73 + auVar78._4_4_;
                    aVar151._8_4_ = fVar131 + auVar78._8_4_;
                    aVar151._12_4_ = fVar150 + auVar78._12_4_;
                    uVar50 = uVar50 + 1;
                  } while (iVar14 != (int)uVar50);
                }
              }
              local_1e60 = minps(local_1e60,(undefined1  [16])aVar103);
              local_1e40.v = (__m128)maxps(local_1e40.v,aVar143.m128);
              local_1d00 = minps(local_1d00,auVar129);
              local_1e50.v = (__m128)maxps(local_1e50.v,aVar151.m128);
              (&local_1cc0)[uVar53 * 2] = aVar103;
              (&local_1cb0)[uVar53 * 2] = aVar143;
              *(undefined1 (*) [16])(local_1bd0 + uVar53 * 0x20) = auVar129;
              (&local_1bc0)[uVar53 * 2] = aVar151;
              uVar53 = (ulong)((int)uVar53 + 1);
              pcVar49 = local_1a88;
              uVar36 = local_1a90;
              pPVar64 = local_1aa0;
              afVar102 = _DAT_01f7a9f0;
              aVar75 = _DAT_01f7aa00;
              fVar172 = local_1e28;
              fVar165 = local_1e24;
            }
            uVar31 = (uint)uVar36;
            uVar65 = uVar65 + 1;
            uVar37 = local_1ab0;
          } while (uVar65 != local_1e78);
        }
        lVar43 = uVar37 * 0x90;
        lVar33 = uVar37 * 0x90;
        pcVar62 = local_1cc8 + lVar33;
        pcVar62[0] = '\0';
        pcVar62[1] = '\0';
        pcVar62[2] = '\0';
        pcVar62[3] = '\0';
        pcVar62[4] = -1;
        pcVar62[5] = -1;
        pcVar62[6] = -1;
        pcVar62[7] = -1;
        pcVar62[8] = '\0';
        pcVar62[9] = '\0';
        pcVar62[10] = '\0';
        pcVar62[0xb] = '\0';
        pcVar62[0xc] = -1;
        pcVar62[0xd] = -1;
        pcVar62[0xe] = -1;
        pcVar62[0xf] = -1;
        pcVar62 = local_1cc8 + 0x10 + lVar33;
        pcVar62[0] = '\0';
        pcVar62[1] = '\0';
        pcVar62[2] = '\0';
        pcVar62[3] = '\0';
        pcVar62[4] = -1;
        pcVar62[5] = -1;
        pcVar62[6] = -1;
        pcVar62[7] = -1;
        pcVar62[8] = '\0';
        pcVar62[9] = '\0';
        pcVar62[10] = '\0';
        pcVar62[0xb] = '\0';
        pcVar62[0xc] = -1;
        pcVar62[0xd] = -1;
        pcVar62[0xe] = -1;
        pcVar62[0xf] = -1;
        pcVar62 = local_1cc8 + 0x20 + lVar43;
        pcVar62[0] = -1;
        pcVar62[1] = -1;
        pcVar62[2] = -1;
        pcVar62[3] = -1;
        pcVar62 = local_1cc8 + 0x30 + lVar33;
        pcVar62[0] = -1;
        pcVar62[1] = -1;
        pcVar62[2] = -1;
        pcVar62[3] = -1;
        pcVar62 = local_1cc8 + 0x28 + lVar33;
        pcVar62[0] = -1;
        pcVar62[1] = -1;
        pcVar62[2] = -1;
        pcVar62[3] = -1;
        pcVar62 = local_1cc8 + 0x24 + lVar43;
        pcVar62[0] = '\0';
        pcVar62[1] = '\0';
        pcVar62[2] = '\0';
        pcVar62[3] = '\0';
        pcVar62 = local_1cc8 + 0x34 + lVar33;
        pcVar62[0] = '\0';
        pcVar62[1] = '\0';
        pcVar62[2] = '\0';
        pcVar62[3] = '\0';
        pcVar62 = local_1cc8 + 0x2c + lVar33;
        pcVar62[0] = '\0';
        pcVar62[1] = '\0';
        pcVar62[2] = '\0';
        pcVar62[3] = '\0';
        pcVar62 = local_1cc8 + 0x50 + lVar43;
        pcVar62[0] = -1;
        pcVar62[1] = -1;
        pcVar62[2] = -1;
        pcVar62[3] = -1;
        pcVar62 = local_1cc8 + 0x60 + lVar33;
        pcVar62[0] = -1;
        pcVar62[1] = -1;
        pcVar62[2] = -1;
        pcVar62[3] = -1;
        pcVar62 = local_1cc8 + 0x58 + lVar33;
        pcVar62[0] = -1;
        pcVar62[1] = -1;
        pcVar62[2] = -1;
        pcVar62[3] = -1;
        pcVar62 = local_1cc8 + 0x54 + lVar43;
        pcVar62[0] = '\0';
        pcVar62[1] = '\0';
        pcVar62[2] = '\0';
        pcVar62[3] = '\0';
        pcVar62 = local_1cc8 + 100 + lVar33;
        pcVar62[0] = '\0';
        pcVar62[1] = '\0';
        pcVar62[2] = '\0';
        pcVar62[3] = '\0';
        pcVar62 = local_1cc8 + 0x5c + lVar33;
        pcVar62[0] = '\0';
        pcVar62[1] = '\0';
        pcVar62[2] = '\0';
        pcVar62[3] = '\0';
        *(uint *)(local_1cc8 + 0x88 + lVar33) = uVar31;
        *(float *)(local_1cc8 + 0x80 + lVar33) = fVar165;
        *(float *)(local_1cc8 + 0x84 + lVar33) = 1.0 / (fVar172 - fVar165);
        local_1240._96_4_ = afVar102[0];
        local_1240._100_4_ = afVar102[1];
        local_1240._104_4_ = afVar102[2];
        local_1240._108_4_ = afVar102[3];
        local_1240._64_4_ = afVar102[0];
        local_1240._68_4_ = afVar102[1];
        local_1240._72_4_ = afVar102[2];
        local_1240._76_4_ = afVar102[3];
        local_1240._32_4_ = afVar102[0];
        local_1240._36_4_ = afVar102[1];
        local_1240._40_4_ = afVar102[2];
        local_1240._44_4_ = afVar102[3];
        local_1240._112_16_ = (undefined1  [16])aVar75;
        local_1240._80_16_ = (undefined1  [16])aVar75;
        local_1240._48_16_ = (undefined1  [16])aVar75;
        local_1240._0_8_ = (undefined8 *)0x8;
        local_1240._8_8_ = 8;
        local_1240._24_8_ = 8;
        local_1240._16_8_ = 8;
        local_17e0[0] = afVar102[0];
        local_17e0[1] = afVar102[1];
        local_17e0[2] = afVar102[2];
        local_17e0[3] = afVar102[3];
        local_1800[0] = afVar102[0];
        local_1800[1] = afVar102[1];
        local_1800[2] = afVar102[2];
        local_1800[3] = afVar102[3];
        local_1820[0] = afVar102[0];
        local_1820[1] = afVar102[1];
        local_1820[2] = afVar102[2];
        local_1820[3] = afVar102[3];
        local_17d0.v = aVar75.v;
        local_17f0 = (undefined1  [16])aVar75;
        local_1810.v = aVar75.v;
        local_1840 = (ThreadLocal2 *)0x8;
        sStack_1838 = 8;
        local_1830.lower = 1.12104e-44;
        local_1830.upper = 0.0;
        BStack_1828.lower = 1.12104e-44;
        BStack_1828.upper = 0.0;
        if ((int)uVar53 != 0) {
          lVar43 = 0;
          do {
            *(ulong *)(pcVar49 + lVar43 * 2) =
                 CONCAT44(*(undefined4 *)((long)&local_1cf0 + lVar43),
                          *(int *)((long)&local_1ae0.field_1.x + lVar43) << 0x10 |
                          (uint)*(ushort *)(local_19b0 + lVar43));
            uVar32 = *(undefined4 *)((long)&local_1cc0 + lVar43 * 8 + 4);
            *(undefined4 *)(local_1240 + lVar43 + 0x20) =
                 *(undefined4 *)((long)&local_1cc0 + lVar43 * 8);
            *(undefined4 *)(local_1240 + lVar43 + 0x40) = uVar32;
            *(undefined4 *)(local_1240 + lVar43 + 0x60) =
                 *(undefined4 *)((long)&local_1cc0 + lVar43 * 8 + 8);
            *(undefined4 *)(local_1240 + lVar43 + 0x30) =
                 *(undefined4 *)((long)&local_1cb0 + lVar43 * 8);
            *(undefined4 *)(local_1240 + lVar43 + 0x50) =
                 *(undefined4 *)((long)&local_1cb0 + lVar43 * 8 + 4);
            *(undefined4 *)(local_1240 + lVar43 + 0x70) =
                 *(undefined4 *)((long)&local_1cb0 + lVar43 * 8 + 8);
            uVar32 = *(undefined4 *)(local_1bd0 + lVar43 * 8 + 4);
            *(undefined4 *)((long)local_1820 + lVar43) = *(undefined4 *)(local_1bd0 + lVar43 * 8);
            *(undefined4 *)((long)local_1800 + lVar43) = uVar32;
            *(undefined4 *)((long)local_17e0 + lVar43) =
                 *(undefined4 *)(local_1bd0 + lVar43 * 8 + 8);
            *(float *)((long)&local_1810 + lVar43) = (&local_1bc0.field_1.x)[lVar43 * 2];
            uVar32 = *(undefined4 *)((long)&local_1bc0 + lVar43 * 8 + 8);
            *(undefined4 *)(local_17f0 + lVar43) =
                 *(undefined4 *)((long)&local_1bc0 + lVar43 * 8 + 4);
            *(undefined4 *)((long)&local_17d0 + lVar43) = uVar32;
            lVar43 = lVar43 + 4;
          } while (uVar53 << 2 != lVar43);
        }
        pcVar62 = local_1cc8 + lVar33;
        fVar175 = local_1240._32_4_;
        fVar176 = local_1240._36_4_;
        fVar179 = local_1240._40_4_;
        fVar180 = local_1240._44_4_;
        fVar172 = local_1240._48_4_;
        fVar165 = local_1240._52_4_;
        fVar171 = local_1240._56_4_;
        fVar177 = local_1240._60_4_;
        uVar31 = -(uint)(fVar175 != afVar102[0]);
        uVar68 = -(uint)(fVar176 != afVar102[1]);
        uVar69 = -(uint)(fVar179 != afVar102[2]);
        uVar70 = -(uint)(fVar180 != afVar102[3]);
        auVar77._4_4_ = fVar175;
        auVar77._0_4_ = fVar176;
        auVar77._8_4_ = fVar180;
        auVar77._12_4_ = fVar179;
        auVar78 = minps(auVar77,local_1240._32_16_);
        auVar134._0_8_ = auVar78._8_8_;
        auVar134._8_4_ = auVar78._0_4_;
        auVar134._12_4_ = auVar78._4_4_;
        auVar169 = minps(auVar134,auVar78);
        auVar79._4_4_ = fVar172;
        auVar79._0_4_ = fVar165;
        auVar79._8_4_ = fVar177;
        auVar79._12_4_ = fVar171;
        auVar78 = maxps(auVar79,local_1240._48_16_);
        auVar15._4_8_ = local_1240._56_8_;
        auVar15._0_4_ = auVar78._4_4_;
        auVar104._0_8_ = auVar15._0_8_ << 0x20;
        auVar104._8_4_ = auVar78._8_4_;
        auVar104._12_4_ = auVar78._12_4_;
        uVar126 = auVar104._8_8_;
        auVar105._8_8_ = auVar78._8_8_;
        auVar105._0_8_ = uVar126;
        if (auVar78._8_4_ <= auVar78._0_4_) {
          auVar106._4_12_ = auVar105._4_12_;
          auVar106._0_4_ = auVar78._0_4_;
          uVar126 = auVar106._0_8_;
        }
        fVar131 = auVar169._0_4_;
        fVar99 = ((float)uVar126 - fVar131) * 1.0000002;
        uVar67 = -(uint)(fVar99 / 255.0 == 0.0);
        auVar144._0_8_ = (ulong)uVar67 & 0xffffffff01000000;
        auVar144._8_8_ = 0;
        local_1eb0 = auVar144 | ZEXT416(~uVar67 & (uint)(fVar99 / 255.0));
        fVar150 = (float)(-(uint)(0.0 < fVar99) & (uint)(255.0 / fVar99));
        fVar99 = floorf((fVar179 - fVar131) * fVar150);
        fVar71 = floorf((fVar180 - fVar131) * fVar150);
        fVar72 = floorf((fVar175 - fVar131) * fVar150);
        fVar73 = floorf((fVar176 - fVar131) * fVar150);
        uVar100 = ~((int)fVar72 >> 0x1f) & (int)fVar72;
        uVar124 = ~((int)fVar73 >> 0x1f) & (int)fVar73;
        uVar125 = ~((int)fVar99 >> 0x1f) & (int)fVar99;
        uVar127 = ~((int)fVar71 >> 0x1f) & (int)fVar71;
        fVar99 = ceilf((fVar171 - fVar131) * fVar150);
        fVar71 = ceilf((fVar177 - fVar131) * fVar150);
        fVar72 = ceilf((fVar172 - fVar131) * fVar150);
        fVar73 = ceilf((fVar165 - fVar131) * fVar150);
        uVar67 = -(uint)(0xfe < (int)fVar72);
        uVar93 = -(uint)(0xfe < (int)fVar73);
        uVar95 = -(uint)(0xfe < (int)fVar99);
        uVar97 = -(uint)(0xfe < (int)fVar71);
        uVar74 = uVar67 & 0xff | ~uVar67 & (int)fVar72;
        uVar94 = uVar93 & 0xff | ~uVar93 & (int)fVar73;
        uVar96 = uVar95 & 0xff | ~uVar95 & (int)fVar99;
        uVar98 = uVar97 & 0xff | ~uVar97 & (int)fVar71;
        uVar67 = -(uint)((float)(int)uVar100 * (float)local_1eb0._0_4_ + fVar131 <= fVar175);
        uVar93 = -(uint)((float)(int)uVar124 * (float)local_1eb0._0_4_ + fVar131 <= fVar176);
        uVar95 = -(uint)((float)(int)uVar125 * (float)local_1eb0._0_4_ + fVar131 <= fVar179);
        uVar97 = -(uint)((float)(int)uVar127 * (float)local_1eb0._0_4_ + fVar131 <= fVar180);
        uVar100 = ~uVar67 & uVar100 - 1 | uVar100 & uVar67;
        uVar124 = ~uVar93 & uVar124 - 1 | uVar124 & uVar93;
        uVar125 = ~uVar95 & uVar125 - 1 | uVar125 & uVar95;
        uVar127 = ~uVar97 & uVar127 - 1 | uVar127 & uVar97;
        uVar67 = -(uint)(fVar172 <= (float)(int)uVar74 * (float)local_1eb0._0_4_ + fVar131);
        uVar93 = -(uint)(fVar165 <= (float)(int)uVar94 * (float)local_1eb0._0_4_ + fVar131);
        uVar95 = -(uint)(fVar171 <= (float)(int)uVar96 * (float)local_1eb0._0_4_ + fVar131);
        uVar97 = -(uint)(fVar177 <= (float)(int)uVar98 * (float)local_1eb0._0_4_ + fVar131);
        uVar74 = ~uVar67 & uVar74 + 1 | uVar74 & uVar67;
        uVar94 = ~uVar93 & uVar94 + 1 | uVar94 & uVar93;
        uVar96 = ~uVar95 & uVar96 + 1 | uVar96 & uVar95;
        uVar98 = ~uVar97 & uVar98 + 1 | uVar98 & uVar97;
        uVar67 = -(uint)(0xfe < (int)uVar74);
        uVar93 = -(uint)(0xfe < (int)uVar94);
        uVar95 = -(uint)(0xfe < (int)uVar96);
        uVar97 = -(uint)(0xfe < (int)uVar98);
        local_1e20._4_4_ = ~uVar68 & 0xff | ~((int)uVar124 >> 0x1f) & uVar124 & uVar68;
        local_1e20._0_4_ = ~uVar31 & 0xff | ~((int)uVar100 >> 0x1f) & uVar100 & uVar31;
        uStack_1e18._0_4_ = ~uVar69 & 0xff | ~((int)uVar125 >> 0x1f) & uVar125 & uVar69;
        uStack_1e18._4_4_ = ~uVar70 & 0xff | ~((int)uVar127 >> 0x1f) & uVar127 & uVar70;
        local_1d90._4_4_ = (uVar93 & 0xff | ~uVar93 & uVar94) & uVar68;
        local_1d90._0_4_ = (uVar67 & 0xff | ~uVar67 & uVar74) & uVar31;
        uStack_1d88._0_4_ = (uVar95 & 0xff | ~uVar95 & uVar96) & uVar69;
        uStack_1d88._4_4_ = (uVar97 & 0xff | ~uVar97 & uVar98) & uVar70;
        lVar43 = 0;
        do {
          pcVar49[lVar43 + 0x20] = local_1e20[lVar43 * 4];
          lVar43 = lVar43 + 1;
        } while (lVar43 != 4);
        lVar43 = 0;
        do {
          pcVar49[lVar43 + 0x24] = local_1d90[lVar43 * 4];
          lVar43 = lVar43 + 1;
        } while (lVar43 != 4);
        *(float *)(pcVar62 + 0x38) = fVar131;
        *(undefined4 *)(pcVar62 + 0x44) = local_1eb0._0_4_;
        fVar175 = local_1240._64_4_;
        fVar176 = local_1240._68_4_;
        fVar179 = local_1240._72_4_;
        fVar180 = local_1240._76_4_;
        fVar172 = local_1240._80_4_;
        fVar165 = local_1240._84_4_;
        fVar171 = local_1240._88_4_;
        fVar177 = local_1240._92_4_;
        uVar31 = -(uint)(fVar175 != INFINITY);
        uVar68 = -(uint)(fVar176 != INFINITY);
        uVar69 = -(uint)(fVar179 != INFINITY);
        uVar70 = -(uint)(fVar180 != INFINITY);
        auVar80._4_4_ = fVar175;
        auVar80._0_4_ = fVar176;
        auVar80._8_4_ = fVar180;
        auVar80._12_4_ = fVar179;
        auVar78 = minps(auVar80,local_1240._64_16_);
        auVar135._0_8_ = auVar78._8_8_;
        auVar135._8_4_ = auVar78._0_4_;
        auVar135._12_4_ = auVar78._4_4_;
        auVar169 = minps(auVar135,auVar78);
        auVar81._4_4_ = fVar172;
        auVar81._0_4_ = fVar165;
        auVar81._8_4_ = fVar177;
        auVar81._12_4_ = fVar171;
        auVar78 = maxps(auVar81,local_1240._80_16_);
        auVar16._4_8_ = local_1240._88_8_;
        auVar16._0_4_ = auVar78._4_4_;
        auVar107._0_8_ = auVar16._0_8_ << 0x20;
        auVar107._8_4_ = auVar78._8_4_;
        auVar107._12_4_ = auVar78._12_4_;
        uVar126 = auVar107._8_8_;
        auVar108._8_8_ = auVar78._8_8_;
        auVar108._0_8_ = uVar126;
        if (auVar78._8_4_ <= auVar78._0_4_) {
          auVar109._4_12_ = auVar108._4_12_;
          auVar109._0_4_ = auVar78._0_4_;
          uVar126 = auVar109._0_8_;
        }
        fVar131 = auVar169._0_4_;
        fVar99 = ((float)uVar126 - fVar131) * 1.0000002;
        uVar67 = -(uint)(fVar99 / 255.0 == 0.0);
        auVar145._0_8_ = (ulong)uVar67 & 0xffffffff01000000;
        auVar145._8_8_ = 0;
        local_1eb0 = auVar145 | ZEXT416(~uVar67 & (uint)(fVar99 / 255.0));
        fVar150 = (float)(-(uint)(0.0 < fVar99) & (uint)(255.0 / fVar99));
        fVar99 = floorf((fVar179 - fVar131) * fVar150);
        fVar71 = floorf((fVar180 - fVar131) * fVar150);
        fVar72 = floorf((fVar175 - fVar131) * fVar150);
        fVar73 = floorf((fVar176 - fVar131) * fVar150);
        uVar100 = ~((int)fVar72 >> 0x1f) & (int)fVar72;
        uVar124 = ~((int)fVar73 >> 0x1f) & (int)fVar73;
        uVar125 = ~((int)fVar99 >> 0x1f) & (int)fVar99;
        uVar127 = ~((int)fVar71 >> 0x1f) & (int)fVar71;
        fVar99 = ceilf((fVar171 - fVar131) * fVar150);
        fVar71 = ceilf((fVar177 - fVar131) * fVar150);
        fVar72 = ceilf((fVar172 - fVar131) * fVar150);
        fVar73 = ceilf((fVar165 - fVar131) * fVar150);
        uVar67 = -(uint)(0xfe < (int)fVar72);
        uVar93 = -(uint)(0xfe < (int)fVar73);
        uVar95 = -(uint)(0xfe < (int)fVar99);
        uVar97 = -(uint)(0xfe < (int)fVar71);
        uVar74 = uVar67 & 0xff | ~uVar67 & (int)fVar72;
        uVar94 = uVar93 & 0xff | ~uVar93 & (int)fVar73;
        uVar96 = uVar95 & 0xff | ~uVar95 & (int)fVar99;
        uVar98 = uVar97 & 0xff | ~uVar97 & (int)fVar71;
        uVar67 = -(uint)((float)(int)uVar100 * (float)local_1eb0._0_4_ + fVar131 <= fVar175);
        uVar93 = -(uint)((float)(int)uVar124 * (float)local_1eb0._0_4_ + fVar131 <= fVar176);
        uVar95 = -(uint)((float)(int)uVar125 * (float)local_1eb0._0_4_ + fVar131 <= fVar179);
        uVar97 = -(uint)((float)(int)uVar127 * (float)local_1eb0._0_4_ + fVar131 <= fVar180);
        uVar100 = ~uVar67 & uVar100 - 1 | uVar100 & uVar67;
        uVar124 = ~uVar93 & uVar124 - 1 | uVar124 & uVar93;
        uVar125 = ~uVar95 & uVar125 - 1 | uVar125 & uVar95;
        uVar127 = ~uVar97 & uVar127 - 1 | uVar127 & uVar97;
        uVar67 = -(uint)(fVar172 <= (float)(int)uVar74 * (float)local_1eb0._0_4_ + fVar131);
        uVar93 = -(uint)(fVar165 <= (float)(int)uVar94 * (float)local_1eb0._0_4_ + fVar131);
        uVar95 = -(uint)(fVar171 <= (float)(int)uVar96 * (float)local_1eb0._0_4_ + fVar131);
        uVar97 = -(uint)(fVar177 <= (float)(int)uVar98 * (float)local_1eb0._0_4_ + fVar131);
        uVar74 = ~uVar67 & uVar74 + 1 | uVar74 & uVar67;
        uVar94 = ~uVar93 & uVar94 + 1 | uVar94 & uVar93;
        uVar96 = ~uVar95 & uVar96 + 1 | uVar96 & uVar95;
        uVar98 = ~uVar97 & uVar98 + 1 | uVar98 & uVar97;
        uVar67 = -(uint)(0xfe < (int)uVar74);
        uVar93 = -(uint)(0xfe < (int)uVar94);
        uVar95 = -(uint)(0xfe < (int)uVar96);
        uVar97 = -(uint)(0xfe < (int)uVar98);
        local_1e20._4_4_ = ~uVar68 & 0xff | ~((int)uVar124 >> 0x1f) & uVar124 & uVar68;
        local_1e20._0_4_ = ~uVar31 & 0xff | ~((int)uVar100 >> 0x1f) & uVar100 & uVar31;
        uStack_1e18._0_4_ = ~uVar69 & 0xff | ~((int)uVar125 >> 0x1f) & uVar125 & uVar69;
        uStack_1e18._4_4_ = ~uVar70 & 0xff | ~((int)uVar127 >> 0x1f) & uVar127 & uVar70;
        local_1d90._4_4_ = (uVar93 & 0xff | ~uVar93 & uVar94) & uVar68;
        local_1d90._0_4_ = (uVar67 & 0xff | ~uVar67 & uVar74) & uVar31;
        uStack_1d88._0_4_ = (uVar95 & 0xff | ~uVar95 & uVar96) & uVar69;
        uStack_1d88._4_4_ = (uVar97 & 0xff | ~uVar97 & uVar98) & uVar70;
        lVar43 = 0;
        do {
          pcVar49[lVar43 + 0x28] = local_1e20[lVar43 * 4];
          lVar43 = lVar43 + 1;
        } while (lVar43 != 4);
        lVar43 = 0;
        do {
          pcVar49[lVar43 + 0x2c] = local_1d90[lVar43 * 4];
          lVar43 = lVar43 + 1;
        } while (lVar43 != 4);
        *(float *)(pcVar62 + 0x3c) = fVar131;
        *(undefined4 *)(pcVar62 + 0x48) = local_1eb0._0_4_;
        fVar175 = local_1240._96_4_;
        fVar176 = local_1240._100_4_;
        fVar179 = local_1240._104_4_;
        fVar180 = local_1240._108_4_;
        fVar172 = local_1240._112_4_;
        fVar165 = local_1240._116_4_;
        fVar171 = local_1240._120_4_;
        fVar177 = local_1240._124_4_;
        uVar31 = -(uint)(fVar175 != INFINITY);
        uVar68 = -(uint)(fVar176 != INFINITY);
        uVar69 = -(uint)(fVar179 != INFINITY);
        uVar70 = -(uint)(fVar180 != INFINITY);
        auVar82._4_4_ = fVar175;
        auVar82._0_4_ = fVar176;
        auVar82._8_4_ = fVar180;
        auVar82._12_4_ = fVar179;
        auVar78 = minps(auVar82,local_1240._96_16_);
        auVar136._0_8_ = auVar78._8_8_;
        auVar136._8_4_ = auVar78._0_4_;
        auVar136._12_4_ = auVar78._4_4_;
        auVar169 = minps(auVar136,auVar78);
        auVar83._4_4_ = fVar172;
        auVar83._0_4_ = fVar165;
        auVar83._8_4_ = fVar177;
        auVar83._12_4_ = fVar171;
        auVar78 = maxps(auVar83,local_1240._112_16_);
        auVar17._4_8_ = local_1240._120_8_;
        auVar17._0_4_ = auVar78._4_4_;
        auVar110._0_8_ = auVar17._0_8_ << 0x20;
        auVar110._8_4_ = auVar78._8_4_;
        auVar110._12_4_ = auVar78._12_4_;
        uVar126 = auVar110._8_8_;
        auVar111._8_8_ = auVar78._8_8_;
        auVar111._0_8_ = uVar126;
        if (auVar78._8_4_ <= auVar78._0_4_) {
          auVar112._4_12_ = auVar111._4_12_;
          auVar112._0_4_ = auVar78._0_4_;
          uVar126 = auVar112._0_8_;
        }
        fVar131 = auVar169._0_4_;
        fVar99 = ((float)uVar126 - fVar131) * 1.0000002;
        uVar67 = -(uint)(fVar99 / 255.0 == 0.0);
        auVar146._0_8_ = (ulong)uVar67 & 0xffffffff01000000;
        auVar146._8_8_ = 0;
        local_1eb0 = auVar146 | ZEXT416(~uVar67 & (uint)(fVar99 / 255.0));
        fVar150 = (float)(-(uint)(0.0 < fVar99) & (uint)(255.0 / fVar99));
        fVar99 = floorf((fVar179 - fVar131) * fVar150);
        fVar71 = floorf((fVar180 - fVar131) * fVar150);
        fVar72 = floorf((fVar175 - fVar131) * fVar150);
        fVar73 = floorf((fVar176 - fVar131) * fVar150);
        uVar100 = ~((int)fVar72 >> 0x1f) & (int)fVar72;
        uVar124 = ~((int)fVar73 >> 0x1f) & (int)fVar73;
        uVar125 = ~((int)fVar99 >> 0x1f) & (int)fVar99;
        uVar127 = ~((int)fVar71 >> 0x1f) & (int)fVar71;
        fVar99 = ceilf((fVar171 - fVar131) * fVar150);
        fVar71 = ceilf((fVar177 - fVar131) * fVar150);
        fVar72 = ceilf((fVar172 - fVar131) * fVar150);
        fVar73 = ceilf((fVar165 - fVar131) * fVar150);
        uVar67 = -(uint)(0xfe < (int)fVar72);
        uVar93 = -(uint)(0xfe < (int)fVar73);
        uVar95 = -(uint)(0xfe < (int)fVar99);
        uVar97 = -(uint)(0xfe < (int)fVar71);
        uVar74 = uVar67 & 0xff | ~uVar67 & (int)fVar72;
        uVar94 = uVar93 & 0xff | ~uVar93 & (int)fVar73;
        uVar96 = uVar95 & 0xff | ~uVar95 & (int)fVar99;
        uVar98 = uVar97 & 0xff | ~uVar97 & (int)fVar71;
        uVar67 = -(uint)((float)(int)uVar100 * (float)local_1eb0._0_4_ + fVar131 <= fVar175);
        uVar93 = -(uint)((float)(int)uVar124 * (float)local_1eb0._0_4_ + fVar131 <= fVar176);
        uVar95 = -(uint)((float)(int)uVar125 * (float)local_1eb0._0_4_ + fVar131 <= fVar179);
        uVar97 = -(uint)((float)(int)uVar127 * (float)local_1eb0._0_4_ + fVar131 <= fVar180);
        uVar100 = ~uVar67 & uVar100 - 1 | uVar100 & uVar67;
        uVar124 = ~uVar93 & uVar124 - 1 | uVar124 & uVar93;
        uVar125 = ~uVar95 & uVar125 - 1 | uVar125 & uVar95;
        uVar127 = ~uVar97 & uVar127 - 1 | uVar127 & uVar97;
        uVar67 = -(uint)(fVar172 <= (float)(int)uVar74 * (float)local_1eb0._0_4_ + fVar131);
        uVar93 = -(uint)(fVar165 <= (float)(int)uVar94 * (float)local_1eb0._0_4_ + fVar131);
        uVar95 = -(uint)(fVar171 <= (float)(int)uVar96 * (float)local_1eb0._0_4_ + fVar131);
        uVar97 = -(uint)(fVar177 <= (float)(int)uVar98 * (float)local_1eb0._0_4_ + fVar131);
        uVar74 = ~uVar67 & uVar74 + 1 | uVar74 & uVar67;
        uVar94 = ~uVar93 & uVar94 + 1 | uVar94 & uVar93;
        uVar96 = ~uVar95 & uVar96 + 1 | uVar96 & uVar95;
        uVar98 = ~uVar97 & uVar98 + 1 | uVar98 & uVar97;
        uVar67 = -(uint)(0xfe < (int)uVar74);
        uVar93 = -(uint)(0xfe < (int)uVar94);
        uVar95 = -(uint)(0xfe < (int)uVar96);
        uVar97 = -(uint)(0xfe < (int)uVar98);
        local_1e20._4_4_ = ~uVar68 & 0xff | ~((int)uVar124 >> 0x1f) & uVar124 & uVar68;
        local_1e20._0_4_ = ~uVar31 & 0xff | ~((int)uVar100 >> 0x1f) & uVar100 & uVar31;
        uStack_1e18._0_4_ = ~uVar69 & 0xff | ~((int)uVar125 >> 0x1f) & uVar125 & uVar69;
        uStack_1e18._4_4_ = ~uVar70 & 0xff | ~((int)uVar127 >> 0x1f) & uVar127 & uVar70;
        local_1d90._4_4_ = (uVar93 & 0xff | ~uVar93 & uVar94) & uVar68;
        local_1d90._0_4_ = (uVar67 & 0xff | ~uVar67 & uVar74) & uVar31;
        uStack_1d88._0_4_ = (uVar95 & 0xff | ~uVar95 & uVar96) & uVar69;
        uStack_1d88._4_4_ = (uVar97 & 0xff | ~uVar97 & uVar98) & uVar70;
        lVar43 = 0;
        do {
          pcVar49[lVar43 + 0x30] = local_1e20[lVar43 * 4];
          lVar43 = lVar43 + 1;
        } while (lVar43 != 4);
        lVar43 = 0;
        do {
          pcVar49[lVar43 + 0x34] = local_1d90[lVar43 * 4];
          lVar43 = lVar43 + 1;
        } while (lVar43 != 4);
        *(float *)(pcVar62 + 0x40) = fVar131;
        *(undefined4 *)(pcVar62 + 0x4c) = local_1eb0._0_4_;
        fVar175 = local_1820[0];
        fVar176 = local_1820[1];
        fVar179 = local_1820[2];
        fVar180 = local_1820[3];
        fVar172 = local_1810.v[0];
        fVar165 = local_1810.v[1];
        fVar171 = local_1810.v[2];
        fVar177 = local_1810.v[3];
        uVar31 = -(uint)(fVar175 != INFINITY);
        uVar68 = -(uint)(fVar176 != INFINITY);
        uVar69 = -(uint)(fVar179 != INFINITY);
        uVar70 = -(uint)(fVar180 != INFINITY);
        auVar84._4_4_ = fVar175;
        auVar84._0_4_ = fVar176;
        auVar84._8_4_ = fVar180;
        auVar84._12_4_ = fVar179;
        auVar78 = minps(auVar84,(undefined1  [16])local_1820);
        auVar137._0_8_ = auVar78._8_8_;
        auVar137._8_4_ = auVar78._0_4_;
        auVar137._12_4_ = auVar78._4_4_;
        auVar169 = minps(auVar137,auVar78);
        auVar85._4_4_ = fVar172;
        auVar85._0_4_ = fVar165;
        auVar85._8_4_ = fVar177;
        auVar85._12_4_ = fVar171;
        auVar78 = maxps(auVar85,(undefined1  [16])local_1810);
        auVar18._4_8_ = local_1810._8_8_;
        auVar18._0_4_ = auVar78._4_4_;
        auVar113._0_8_ = auVar18._0_8_ << 0x20;
        auVar113._8_4_ = auVar78._8_4_;
        auVar113._12_4_ = auVar78._12_4_;
        uVar126 = auVar113._8_8_;
        auVar114._8_8_ = auVar78._8_8_;
        auVar114._0_8_ = uVar126;
        if (auVar78._8_4_ <= auVar78._0_4_) {
          auVar115._4_12_ = auVar114._4_12_;
          auVar115._0_4_ = auVar78._0_4_;
          uVar126 = auVar115._0_8_;
        }
        fVar131 = auVar169._0_4_;
        fVar99 = ((float)uVar126 - fVar131) * 1.0000002;
        uVar67 = -(uint)(fVar99 / 255.0 == 0.0);
        auVar147._0_8_ = (ulong)uVar67 & 0xffffffff01000000;
        auVar147._8_8_ = 0;
        local_1eb0 = auVar147 | ZEXT416(~uVar67 & (uint)(fVar99 / 255.0));
        fVar150 = (float)(-(uint)(0.0 < fVar99) & (uint)(255.0 / fVar99));
        fVar99 = floorf((fVar179 - fVar131) * fVar150);
        fVar71 = floorf((fVar180 - fVar131) * fVar150);
        fVar72 = floorf((fVar175 - fVar131) * fVar150);
        fVar73 = floorf((fVar176 - fVar131) * fVar150);
        uVar100 = ~((int)fVar72 >> 0x1f) & (int)fVar72;
        uVar124 = ~((int)fVar73 >> 0x1f) & (int)fVar73;
        uVar125 = ~((int)fVar99 >> 0x1f) & (int)fVar99;
        uVar127 = ~((int)fVar71 >> 0x1f) & (int)fVar71;
        fVar99 = ceilf((fVar171 - fVar131) * fVar150);
        fVar71 = ceilf((fVar177 - fVar131) * fVar150);
        fVar72 = ceilf((fVar172 - fVar131) * fVar150);
        fVar73 = ceilf((fVar165 - fVar131) * fVar150);
        uVar67 = -(uint)(0xfe < (int)fVar72);
        uVar93 = -(uint)(0xfe < (int)fVar73);
        uVar95 = -(uint)(0xfe < (int)fVar99);
        uVar97 = -(uint)(0xfe < (int)fVar71);
        uVar74 = uVar67 & 0xff | ~uVar67 & (int)fVar72;
        uVar94 = uVar93 & 0xff | ~uVar93 & (int)fVar73;
        uVar96 = uVar95 & 0xff | ~uVar95 & (int)fVar99;
        uVar98 = uVar97 & 0xff | ~uVar97 & (int)fVar71;
        uVar67 = -(uint)((float)(int)uVar100 * (float)local_1eb0._0_4_ + fVar131 <= fVar175);
        uVar93 = -(uint)((float)(int)uVar124 * (float)local_1eb0._0_4_ + fVar131 <= fVar176);
        uVar95 = -(uint)((float)(int)uVar125 * (float)local_1eb0._0_4_ + fVar131 <= fVar179);
        uVar97 = -(uint)((float)(int)uVar127 * (float)local_1eb0._0_4_ + fVar131 <= fVar180);
        uVar100 = ~uVar67 & uVar100 - 1 | uVar100 & uVar67;
        uVar124 = ~uVar93 & uVar124 - 1 | uVar124 & uVar93;
        uVar125 = ~uVar95 & uVar125 - 1 | uVar125 & uVar95;
        uVar127 = ~uVar97 & uVar127 - 1 | uVar127 & uVar97;
        uVar67 = -(uint)(fVar172 <= (float)(int)uVar74 * (float)local_1eb0._0_4_ + fVar131);
        uVar93 = -(uint)(fVar165 <= (float)(int)uVar94 * (float)local_1eb0._0_4_ + fVar131);
        uVar95 = -(uint)(fVar171 <= (float)(int)uVar96 * (float)local_1eb0._0_4_ + fVar131);
        uVar97 = -(uint)(fVar177 <= (float)(int)uVar98 * (float)local_1eb0._0_4_ + fVar131);
        uVar74 = ~uVar67 & uVar74 + 1 | uVar74 & uVar67;
        uVar94 = ~uVar93 & uVar94 + 1 | uVar94 & uVar93;
        uVar96 = ~uVar95 & uVar96 + 1 | uVar96 & uVar95;
        uVar98 = ~uVar97 & uVar98 + 1 | uVar98 & uVar97;
        uVar67 = -(uint)(0xfe < (int)uVar74);
        uVar93 = -(uint)(0xfe < (int)uVar94);
        uVar95 = -(uint)(0xfe < (int)uVar96);
        uVar97 = -(uint)(0xfe < (int)uVar98);
        local_1e20._4_4_ = ~uVar68 & 0xff | ~((int)uVar124 >> 0x1f) & uVar124 & uVar68;
        local_1e20._0_4_ = ~uVar31 & 0xff | ~((int)uVar100 >> 0x1f) & uVar100 & uVar31;
        uStack_1e18._0_4_ = ~uVar69 & 0xff | ~((int)uVar125 >> 0x1f) & uVar125 & uVar69;
        uStack_1e18._4_4_ = ~uVar70 & 0xff | ~((int)uVar127 >> 0x1f) & uVar127 & uVar70;
        local_1d90._4_4_ = (uVar93 & 0xff | ~uVar93 & uVar94) & uVar68;
        local_1d90._0_4_ = (uVar67 & 0xff | ~uVar67 & uVar74) & uVar31;
        uStack_1d88._0_4_ = (uVar95 & 0xff | ~uVar95 & uVar96) & uVar69;
        uStack_1d88._4_4_ = (uVar97 & 0xff | ~uVar97 & uVar98) & uVar70;
        lVar43 = 0;
        do {
          pcVar49[lVar43 + 0x50] = local_1e20[lVar43 * 4];
          lVar43 = lVar43 + 1;
        } while (lVar43 != 4);
        lVar43 = 0;
        do {
          pcVar49[lVar43 + 0x54] = local_1d90[lVar43 * 4];
          lVar43 = lVar43 + 1;
        } while (lVar43 != 4);
        *(float *)(pcVar62 + 0x68) = fVar131;
        *(undefined4 *)(pcVar62 + 0x74) = local_1eb0._0_4_;
        fVar175 = local_1800[0];
        fVar176 = local_1800[1];
        fVar179 = local_1800[2];
        fVar180 = local_1800[3];
        fVar172 = local_17f0._0_4_;
        fVar165 = local_17f0._4_4_;
        fVar171 = local_17f0._8_4_;
        fVar177 = local_17f0._12_4_;
        uVar31 = -(uint)(fVar175 != INFINITY);
        uVar68 = -(uint)(fVar176 != INFINITY);
        uVar69 = -(uint)(fVar179 != INFINITY);
        uVar70 = -(uint)(fVar180 != INFINITY);
        auVar86._4_4_ = fVar175;
        auVar86._0_4_ = fVar176;
        auVar86._8_4_ = fVar180;
        auVar86._12_4_ = fVar179;
        auVar78 = minps(auVar86,(undefined1  [16])local_1800);
        auVar138._0_8_ = auVar78._8_8_;
        auVar138._8_4_ = auVar78._0_4_;
        auVar138._12_4_ = auVar78._4_4_;
        auVar169 = minps(auVar138,auVar78);
        auVar87._4_4_ = fVar172;
        auVar87._0_4_ = fVar165;
        auVar87._8_4_ = fVar177;
        auVar87._12_4_ = fVar171;
        auVar78 = maxps(auVar87,local_17f0);
        auVar19._4_8_ = local_17f0._8_8_;
        auVar19._0_4_ = auVar78._4_4_;
        auVar116._0_8_ = auVar19._0_8_ << 0x20;
        auVar116._8_4_ = auVar78._8_4_;
        auVar116._12_4_ = auVar78._12_4_;
        uVar126 = auVar116._8_8_;
        auVar117._8_8_ = auVar78._8_8_;
        auVar117._0_8_ = uVar126;
        if (auVar78._8_4_ <= auVar78._0_4_) {
          auVar118._4_12_ = auVar117._4_12_;
          auVar118._0_4_ = auVar78._0_4_;
          uVar126 = auVar118._0_8_;
        }
        fVar131 = auVar169._0_4_;
        fVar99 = ((float)uVar126 - fVar131) * 1.0000002;
        uVar67 = -(uint)(fVar99 / 255.0 == 0.0);
        auVar148._0_8_ = (ulong)uVar67 & 0xffffffff01000000;
        auVar148._8_8_ = 0;
        local_1eb0 = auVar148 | ZEXT416(~uVar67 & (uint)(fVar99 / 255.0));
        fVar150 = (float)(-(uint)(0.0 < fVar99) & (uint)(255.0 / fVar99));
        fVar99 = floorf((fVar179 - fVar131) * fVar150);
        fVar71 = floorf((fVar180 - fVar131) * fVar150);
        fVar72 = floorf((fVar175 - fVar131) * fVar150);
        fVar73 = floorf((fVar176 - fVar131) * fVar150);
        uVar100 = ~((int)fVar72 >> 0x1f) & (int)fVar72;
        uVar124 = ~((int)fVar73 >> 0x1f) & (int)fVar73;
        uVar125 = ~((int)fVar99 >> 0x1f) & (int)fVar99;
        uVar127 = ~((int)fVar71 >> 0x1f) & (int)fVar71;
        fVar99 = ceilf((fVar171 - fVar131) * fVar150);
        fVar71 = ceilf((fVar177 - fVar131) * fVar150);
        fVar72 = ceilf((fVar172 - fVar131) * fVar150);
        fVar73 = ceilf((fVar165 - fVar131) * fVar150);
        uVar67 = -(uint)(0xfe < (int)fVar72);
        uVar93 = -(uint)(0xfe < (int)fVar73);
        uVar95 = -(uint)(0xfe < (int)fVar99);
        uVar97 = -(uint)(0xfe < (int)fVar71);
        uVar74 = uVar67 & 0xff | ~uVar67 & (int)fVar72;
        uVar94 = uVar93 & 0xff | ~uVar93 & (int)fVar73;
        uVar96 = uVar95 & 0xff | ~uVar95 & (int)fVar99;
        uVar98 = uVar97 & 0xff | ~uVar97 & (int)fVar71;
        uVar67 = -(uint)((float)(int)uVar100 * (float)local_1eb0._0_4_ + fVar131 <= fVar175);
        uVar93 = -(uint)((float)(int)uVar124 * (float)local_1eb0._0_4_ + fVar131 <= fVar176);
        uVar95 = -(uint)((float)(int)uVar125 * (float)local_1eb0._0_4_ + fVar131 <= fVar179);
        uVar97 = -(uint)((float)(int)uVar127 * (float)local_1eb0._0_4_ + fVar131 <= fVar180);
        uVar100 = ~uVar67 & uVar100 - 1 | uVar100 & uVar67;
        uVar124 = ~uVar93 & uVar124 - 1 | uVar124 & uVar93;
        uVar125 = ~uVar95 & uVar125 - 1 | uVar125 & uVar95;
        uVar127 = ~uVar97 & uVar127 - 1 | uVar127 & uVar97;
        uVar67 = -(uint)(fVar172 <= (float)(int)uVar74 * (float)local_1eb0._0_4_ + fVar131);
        uVar93 = -(uint)(fVar165 <= (float)(int)uVar94 * (float)local_1eb0._0_4_ + fVar131);
        uVar95 = -(uint)(fVar171 <= (float)(int)uVar96 * (float)local_1eb0._0_4_ + fVar131);
        uVar97 = -(uint)(fVar177 <= (float)(int)uVar98 * (float)local_1eb0._0_4_ + fVar131);
        uVar74 = ~uVar67 & uVar74 + 1 | uVar74 & uVar67;
        uVar94 = ~uVar93 & uVar94 + 1 | uVar94 & uVar93;
        uVar96 = ~uVar95 & uVar96 + 1 | uVar96 & uVar95;
        uVar98 = ~uVar97 & uVar98 + 1 | uVar98 & uVar97;
        uVar67 = -(uint)(0xfe < (int)uVar74);
        uVar93 = -(uint)(0xfe < (int)uVar94);
        uVar95 = -(uint)(0xfe < (int)uVar96);
        uVar97 = -(uint)(0xfe < (int)uVar98);
        local_1e20._4_4_ = ~uVar68 & 0xff | ~((int)uVar124 >> 0x1f) & uVar124 & uVar68;
        local_1e20._0_4_ = ~uVar31 & 0xff | ~((int)uVar100 >> 0x1f) & uVar100 & uVar31;
        uStack_1e18._0_4_ = ~uVar69 & 0xff | ~((int)uVar125 >> 0x1f) & uVar125 & uVar69;
        uStack_1e18._4_4_ = ~uVar70 & 0xff | ~((int)uVar127 >> 0x1f) & uVar127 & uVar70;
        local_1d90._4_4_ = (uVar93 & 0xff | ~uVar93 & uVar94) & uVar68;
        local_1d90._0_4_ = (uVar67 & 0xff | ~uVar67 & uVar74) & uVar31;
        uStack_1d88._0_4_ = (uVar95 & 0xff | ~uVar95 & uVar96) & uVar69;
        uStack_1d88._4_4_ = (uVar97 & 0xff | ~uVar97 & uVar98) & uVar70;
        lVar43 = 0;
        do {
          pcVar49[lVar43 + 0x58] = local_1e20[lVar43 * 4];
          lVar43 = lVar43 + 1;
        } while (lVar43 != 4);
        lVar43 = 0;
        do {
          pcVar49[lVar43 + 0x5c] = local_1d90[lVar43 * 4];
          lVar43 = lVar43 + 1;
        } while (lVar43 != 4);
        *(float *)(pcVar62 + 0x6c) = fVar131;
        *(undefined4 *)(pcVar62 + 0x78) = local_1eb0._0_4_;
        fVar175 = local_17e0[0];
        fVar176 = local_17e0[1];
        fVar179 = local_17e0[2];
        fVar180 = local_17e0[3];
        fVar172 = local_17d0.v[0];
        fVar165 = local_17d0.v[1];
        fVar171 = local_17d0.v[2];
        fVar177 = local_17d0.v[3];
        auVar88._4_4_ = fVar175;
        auVar88._0_4_ = fVar176;
        auVar88._8_4_ = fVar180;
        auVar88._12_4_ = fVar179;
        auVar78 = minps(auVar88,(undefined1  [16])local_17e0);
        auVar139._0_8_ = auVar78._8_8_;
        auVar139._8_4_ = auVar78._0_4_;
        auVar139._12_4_ = auVar78._4_4_;
        auVar169 = minps(auVar139,auVar78);
        auVar89._4_4_ = fVar172;
        auVar89._0_4_ = fVar165;
        auVar89._8_4_ = fVar177;
        auVar89._12_4_ = fVar171;
        auVar78 = maxps(auVar89,(undefined1  [16])local_17d0);
        auVar20._4_8_ = local_17d0._8_8_;
        auVar20._0_4_ = auVar78._4_4_;
        auVar119._0_8_ = auVar20._0_8_ << 0x20;
        auVar119._8_4_ = auVar78._8_4_;
        auVar119._12_4_ = auVar78._12_4_;
        uVar126 = auVar119._8_8_;
        auVar120._8_8_ = auVar78._8_8_;
        auVar120._0_8_ = uVar126;
        if (auVar78._8_4_ <= auVar78._0_4_) {
          auVar121._4_12_ = auVar120._4_12_;
          auVar121._0_4_ = auVar78._0_4_;
          uVar126 = auVar121._0_8_;
        }
        fVar131 = auVar169._0_4_;
        fVar99 = ((float)uVar126 - fVar131) * 1.0000002;
        uVar31 = -(uint)(fVar99 / 255.0 == 0.0);
        auVar149._0_8_ = (ulong)uVar31 & 0xffffffff01000000;
        auVar149._8_8_ = 0;
        local_1eb0 = auVar149 | ZEXT416(~uVar31 & (uint)(fVar99 / 255.0));
        fVar150 = (float)(-(uint)(0.0 < fVar99) & (uint)(255.0 / fVar99));
        fVar99 = floorf((fVar179 - fVar131) * fVar150);
        fVar71 = floorf((fVar180 - fVar131) * fVar150);
        fVar72 = floorf((fVar175 - fVar131) * fVar150);
        fVar73 = floorf((fVar176 - fVar131) * fVar150);
        uVar74 = ~((int)fVar72 >> 0x1f) & (int)fVar72;
        uVar94 = ~((int)fVar73 >> 0x1f) & (int)fVar73;
        uVar96 = ~((int)fVar99 >> 0x1f) & (int)fVar99;
        uVar98 = ~((int)fVar71 >> 0x1f) & (int)fVar71;
        fVar99 = ceilf((fVar171 - fVar131) * fVar150);
        fVar71 = ceilf((fVar177 - fVar131) * fVar150);
        fVar72 = ceilf((fVar172 - fVar131) * fVar150);
        fVar73 = ceilf((fVar165 - fVar131) * fVar150);
        fVar150 = local_1eb0._0_4_;
        auVar122._0_4_ = (int)fVar72;
        auVar122._4_4_ = (int)fVar73;
        auVar122._8_4_ = (int)fVar99;
        auVar122._12_4_ = (int)fVar71;
        auVar90._0_4_ = -(uint)((int)DAT_01f8c500 < auVar122._0_4_);
        auVar90._4_4_ = -(uint)(DAT_01f8c500._4_4_ < auVar122._4_4_);
        auVar90._8_4_ = -(uint)(DAT_01f8c500._8_4_ < auVar122._8_4_);
        auVar90._12_4_ = -(uint)(DAT_01f8c500._12_4_ < auVar122._12_4_);
        auVar78 = auVar90 & _DAT_01f8c510 | ~auVar90 & auVar122;
        uVar67 = auVar78._0_4_;
        uVar93 = auVar78._4_4_;
        uVar95 = auVar78._8_4_;
        uVar97 = auVar78._12_4_;
        uVar31 = -(uint)((float)(int)uVar74 * fVar150 + fVar131 <= fVar175);
        uVar68 = -(uint)((float)(int)uVar94 * fVar150 + fVar131 <= fVar176);
        uVar69 = -(uint)((float)(int)uVar96 * fVar150 + fVar131 <= fVar179);
        uVar70 = -(uint)((float)(int)uVar98 * fVar150 + fVar131 <= fVar180);
        auVar163._0_4_ = uVar74 & uVar31;
        auVar163._4_4_ = uVar94 & uVar68;
        auVar163._8_4_ = uVar96 & uVar69;
        auVar163._12_4_ = uVar98 & uVar70;
        auVar123._0_4_ = ~uVar31 & uVar74 - 1;
        auVar123._4_4_ = ~uVar68 & uVar94 - 1;
        auVar123._8_4_ = ~uVar69 & uVar96 - 1;
        auVar123._12_4_ = ~uVar70 & uVar98 - 1;
        auVar123 = auVar123 | auVar163;
        auVar130._0_4_ = auVar123._0_4_ >> 0x1f;
        auVar130._4_4_ = auVar123._4_4_ >> 0x1f;
        auVar130._8_4_ = auVar123._8_4_ >> 0x1f;
        auVar130._12_4_ = auVar123._12_4_ >> 0x1f;
        uVar31 = -(uint)(fVar172 <= (float)(int)uVar67 * fVar150 + fVar131);
        uVar68 = -(uint)(fVar165 <= (float)(int)uVar93 * fVar150 + fVar131);
        uVar69 = -(uint)(fVar171 <= (float)(int)uVar95 * fVar150 + fVar131);
        uVar70 = -(uint)(fVar177 <= (float)(int)uVar97 * fVar150 + fVar131);
        auVar91._0_4_ = uVar67 & uVar31;
        auVar91._4_4_ = uVar93 & uVar68;
        auVar91._8_4_ = uVar95 & uVar69;
        auVar91._12_4_ = uVar97 & uVar70;
        auVar140._0_4_ = ~uVar31 & uVar67 + 1;
        auVar140._4_4_ = ~uVar68 & uVar93 + 1;
        auVar140._8_4_ = ~uVar69 & uVar95 + 1;
        auVar140._12_4_ = ~uVar70 & uVar97 + 1;
        auVar140 = auVar140 | auVar91;
        auVar92._0_4_ = -(uint)((int)DAT_01f8c500 < auVar140._0_4_);
        auVar92._4_4_ = -(uint)(DAT_01f8c500._4_4_ < auVar140._4_4_);
        auVar92._8_4_ = -(uint)(DAT_01f8c500._8_4_ < auVar140._8_4_);
        auVar92._12_4_ = -(uint)(DAT_01f8c500._12_4_ < auVar140._12_4_);
        auVar24._4_4_ = -(uint)(fVar176 != INFINITY);
        auVar24._0_4_ = -(uint)(fVar175 != INFINITY);
        auVar24._8_4_ = -(uint)(fVar179 != INFINITY);
        auVar24._12_4_ = -(uint)(fVar180 != INFINITY);
        _local_1e20 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                      (~auVar24 & _DAT_01f8c510 | ~auVar130 & auVar123 & auVar24);
        _local_1d90 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                      ((auVar92 & _DAT_01f8c510 | ~auVar92 & auVar140) & auVar24);
        lVar43 = 0;
        do {
          pcVar49[lVar43 + 0x60] = local_1e20[lVar43 * 4];
          aVar75 = _DAT_01f7aa00;
          lVar43 = lVar43 + 1;
        } while (lVar43 != 4);
        lVar43 = 0;
        do {
          pcVar49[lVar43 + 100] = local_1d90[lVar43 * 4];
          lVar43 = lVar43 + 1;
        } while (lVar43 != 4);
        *(float *)(pcVar62 + 0x70) = fVar131;
        *(float *)(pcVar62 + 0x7c) = fVar150;
        uVar37 = uVar37 + 1;
        pcVar49 = pcVar49 + 0x90;
      } while (uVar37 != local_1cd0);
    }
    (local_1e88->ref).ptr = local_1ab8;
    *(undefined8 *)&(local_1e88->lbounds).bounds0.lower.field_0 = local_1e60._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds0.lower.field_0 + 8) = local_1e60._8_8_;
    *(undefined8 *)&(local_1e88->lbounds).bounds0.upper.field_0 = local_1e40._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds0.upper.field_0 + 8) = local_1e40._8_8_;
    *(undefined8 *)&(local_1e88->lbounds).bounds1.lower.field_0 = local_1d00._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds1.lower.field_0 + 8) = local_1d00._8_8_;
    *(undefined8 *)&(local_1e88->lbounds).bounds1.upper.field_0 = local_1e50._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds1.upper.field_0 + 8) = local_1e50._8_8_;
    local_1e88->dt = BStack_1898;
    return local_1e88;
  }
  lVar43 = 0xbc;
  do {
    *(undefined8 *)((long)&uStack_124c + lVar43) = 0xffffffff7f800000;
    *(undefined8 *)(&stack0xffffffffffffedbc + lVar43) = 0;
    lVar43 = lVar43 + 0xf0;
  } while (lVar43 != 0xfbc);
  local_2c0 = 1;
  local_b8 = 1;
  local_1240._0_8_ = uVar37;
  local_1240._16_16_ = (undefined1  [16])aVar103;
  local_1240._32_16_ = (undefined1  [16])aVar143;
  local_1240._48_16_ = (undefined1  [16])aVar151;
  local_1240._64_16_ = (undefined1  [16])aVar25;
  local_1240._80_16_ = (undefined1  [16])aVar26;
  local_1240._96_16_ = (undefined1  [16])aVar27;
  unique0x10004ed8 = sStack_1838;
  local_1240._128_8_ = local_1840;
  local_1240._112_8_ = prVar3->_begin;
  local_1240._120_8_ = prVar3->_end;
  local_11b0 = local_1830;
  BStack_11a8 = BStack_1828;
  local_11a0[0] = BVar44;
  local_1190._8_8_ = local_1240._8_8_;
  local_2b8 = BVar44;
  local_2b0[0].lower = 2.8026e-45;
  local_2b0[0].upper = 0.0;
  local_340[0] = &local_2b8;
  local_1e60._0_8_ = &this->heuristicTemporalSplit;
  local_1e40._0_8_ = &local_1c40;
  local_1e50._0_8_ = &local_1b50;
  local_1f10._8_8_ = 0x7f8000007f800000;
  local_1f10._0_8_ = 0x7f8000007f800000;
  local_1f70._8_8_ = 0xff800000ff800000;
  local_1f70._0_8_ = 0xff800000ff800000;
  uVar37 = 0;
  do {
    if (local_2c0 == 0) goto LAB_00c951c1;
    uVar65 = 0xffffffffffffffff;
    plVar47 = (long *)(local_1240 + 0x70);
    uVar36 = 0;
    uVar53 = 0;
    do {
      uVar58 = plVar47[1] - *plVar47;
      if ((((this->cfg).maxLeafSize < uVar58) || (1 < *(uint *)((long)plVar47 + 0x4c))) || (bVar28))
      {
        if (uVar36 < uVar58) {
          uVar65 = uVar53;
          uVar36 = uVar58;
        }
        bVar28 = false;
      }
      uVar53 = uVar53 + 1;
      plVar47 = plVar47 + 0x1e;
    } while (local_2c0 != uVar53);
    if (uVar65 == 0xffffffffffffffff) goto LAB_00c95177;
    local_1eb0._0_8_ = uVar37;
    lVar43 = uVar65 * 0xf0;
    local_1cc0._0_8_ = (ThreadLocal2 *)(local_1930 + 1);
    local_1c10 = (anon_class_1_0_00000001 *)0xffffffff7f800000;
    sStack_1c08 = 0;
    local_1bd0._0_8_ = (ThreadLocal2 *)(local_1930 + 1);
    local_1b20 = 0xffffffff7f800000;
    sStack_1b18 = 0;
    iVar56 = *(int *)((long)local_1180 + lVar43 + -4);
    if (iVar56 == 0) {
      sVar40 = *(size_t *)(local_1240 + uVar65 * 0xf0 + 0x70);
      end = *(size_t *)(local_1240 + lVar43 + 0x78);
      uStack_1e18 = 0x7f8000007f800000;
      local_1e20 = (undefined1  [8])0x7f8000007f800000;
      local_1e10._0_8_ = 0xff800000ff800000;
      local_1e10._8_8_ = 0xff800000ff800000;
      local_1e00._0_8_ = 0x7f8000007f800000;
      local_1e00._8_8_ = 0x7f8000007f800000;
      local_1df0._0_8_ = 0xff800000ff800000;
      local_1df0._8_8_ = 0xff800000ff800000;
      local_1de0._0_8_ = 0x7f8000007f800000;
      local_1de0._8_8_ = 0x7f8000007f800000;
      local_1dd0._0_8_ = 0xff800000ff800000;
      local_1dd0._8_8_ = 0xff800000ff800000;
      local_1da0 = 0.0;
      local_1db0 = 0;
      sStack_1da8 = 0;
      local_1dc0 = 0;
      sStack_1db8 = 0;
      fStack_1d9c = 1.0;
      fStack_1d98 = 1.0;
      fStack_1d94 = 0.0;
      uStack_1d88 = 0x7f8000007f800000;
      local_1d90 = (undefined1  [8])0x7f8000007f800000;
      local_1d80._0_8_ = 0xff800000ff800000;
      local_1d80._8_8_ = 0xff800000ff800000;
      local_1d70._0_8_ = 0x7f8000007f800000;
      local_1d70._8_8_ = 0x7f8000007f800000;
      local_1d60._0_8_ = 0xff800000ff800000;
      local_1d60._8_8_ = 0xff800000ff800000;
      local_1d50._0_8_ = 0x7f8000007f800000;
      local_1d50._8_8_ = 0x7f8000007f800000;
      local_1d40._0_8_ = 0xff800000ff800000;
      local_1d40._8_8_ = 0xff800000ff800000;
      local_1d10 = 0.0;
      local_1d20 = 0;
      sStack_1d18 = 0;
      local_1d30 = 0;
      sStack_1d28 = 0;
      fStack_1d0c = 1.0;
      fStack_1d08 = 1.0;
      fStack_1d04 = 0.0;
      local_19b0._4_4_ = (undefined4)local_1180[uVar65 * 0x1e + -1];
      local_19b0._0_4_ = local_19b0._4_4_;
      local_19b0._12_4_ = local_19b0._4_4_;
      local_19b0._8_4_ = local_19b0._4_4_;
      lVar33 = (long)(1 << (*(byte *)((long)&local_1190 + uVar65 * 0xf0 + 4) & 0x1f)) * 0x10;
      local_1ae0.m128[0] = ((BBox1f *)(mm_lookupmask_ps + lVar33))->lower;
      local_1ae0.m128[1] = ((BBox1f *)(mm_lookupmask_ps + lVar33))->upper;
      local_1ae0._8_8_ = *(undefined1 **)(mm_lookupmask_ps + lVar33 + 8);
      local_1a50._0_8_ = &local_1190 + uVar65 * 0xf;
      stack0xffffffffffffe5b8 = (vint *)local_19b0;
      local_1a40._0_8_ = &local_1ae0;
      sStack_1c48 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                              (*(PrimRefMB **)((long)local_11a0[uVar65 * 0x1e] + 0x20),sVar40,end,
                               (EmptyTy *)local_1a60,
                               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1e20,
                               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1d90,
                               (anon_class_24_3_c5d13451 *)local_1a50,
                               (anon_class_1_0_00000001 *)&local_1cf0.field_1,
                               (anon_class_1_0_00000001 *)&local_1a78,0x80,0xc00);
      local_1c20 = local_11a0[uVar65 * 0x1e];
      BVar44 = local_11a0[uVar65 * 0x1e + -1];
      local_1c80._8_8_ = local_1df0._8_8_;
      local_1c80._0_8_ = local_1df0._0_8_;
      local_1cb0._0_8_ = local_1e20;
      local_1cb0._8_8_ = uStack_1e18;
      local_1ca0 = local_1e10._0_8_;
      uStack_1c98 = local_1e10._8_8_;
      local_1c90 = local_1e00._0_8_;
      uStack_1c88 = local_1e00._8_8_;
      local_1c70 = local_1de0._0_8_;
      uStack_1c68 = local_1de0._8_8_;
      local_1c60 = local_1dd0._0_8_;
      uStack_1c58 = local_1dd0._8_8_;
      *(size_t *)(local_1e40._0_8_ + 0x10) = CONCAT44(fStack_1d9c,local_1da0);
      *(size_t *)(local_1e40._0_8_ + 0x18) = CONCAT44(fStack_1d94,fStack_1d98);
      *(size_t *)local_1e40._0_8_ = local_1db0;
      *(size_t *)(local_1e40._0_8_ + 8) = sStack_1da8;
      fVar165 = BVar44.lower;
      fVar172 = fVar165;
      if (fVar165 <= BStack_1c28.lower) {
        fVar172 = BStack_1c28.lower;
      }
      fVar171 = BVar44.upper;
      if (fVar171 <= BStack_1c28.upper) {
        BStack_1c28.upper = fVar171;
      }
      BStack_1c28.lower = fVar172;
      local_1bc0._0_8_ = local_1d90;
      local_1bc0._8_8_ = uStack_1d88;
      local_1bb0 = local_1d80._0_8_;
      uStack_1ba8 = local_1d80._8_8_;
      local_1ba0 = local_1d70._0_8_;
      uStack_1b98 = local_1d70._8_8_;
      local_1b90 = local_1d60._0_8_;
      uStack_1b88 = local_1d60._8_8_;
      local_1b80._8_8_ = local_1d50._8_8_;
      local_1b80._0_8_ = local_1d50._0_8_;
      local_1b70._8_8_ = local_1d40._8_8_;
      local_1b70._0_8_ = local_1d40._0_8_;
      *(size_t *)(local_1e50._0_8_ + 0x10) = CONCAT44(fStack_1d0c,local_1d10);
      *(size_t *)(local_1e50._0_8_ + 0x18) = CONCAT44(fStack_1d04,fStack_1d08);
      *(size_t *)local_1e50._0_8_ = local_1d20;
      *(size_t *)(local_1e50._0_8_ + 8) = sStack_1d18;
      if (fVar165 <= BStack_1b38.lower) {
        BVar44 = (BBox1f)((ulong)BStack_1b38 & 0xffffffff);
      }
      if (fVar171 <= BStack_1b38.upper) {
        BStack_1b38.upper = fVar171;
      }
      BStack_1b38.lower = BVar44.lower;
      local_1c50 = sVar40;
      local_1b60 = sStack_1c48;
      sStack_1b58 = end;
      local_1b30 = local_1c20;
LAB_00c943e1:
      local_1eb8.lower = 0.0;
      local_1eb8.upper = 0.0;
      bVar66 = false;
    }
    else {
      this_00 = (SetMB *)(local_1240 + uVar65 * 0xf0 + 0x10);
      if (iVar56 != 2) {
        if (iVar56 == 1) {
          SetMB::deterministic_order(this_00);
          splitFallback(this,this_00,(SetMB *)&local_1cb0.field_1,(SetMB *)&local_1bc0.field_1);
        }
        else if (iVar56 == 3) {
          SetMB::deterministic_order(this_00);
          splitByGeometry(this,this_00,(SetMB *)&local_1cb0.field_1,(SetMB *)&local_1bc0.field_1);
        }
        goto LAB_00c943e1;
      }
      local_1e70.m128[0] = (float)*(undefined4 *)(local_1180 + uVar65 * 0x1e + -1);
      local_1e70.m128[2] = local_11a0[uVar65 * 0x1e + -1].lower;
      local_1e70.m128[1] = local_11a0[uVar65 * 0x1e + -1].upper;
      BVar44 = local_11a0[uVar65 * 0x1e];
      local_1e70.m128[3] = local_1e70.m128[0];
      BVar34 = (BBox1f)operator_new(0x28);
      puVar41 = *(undefined8 **)local_1e60._0_8_;
      paVar51 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)(local_1240 + lVar43 + 0x78);
      *(undefined8 **)BVar34 = puVar41;
      *(undefined1 *)((long)BVar34 + 8) = 0;
      *(undefined8 *)((long)BVar34 + 0x10) = 0;
      *(undefined8 *)((long)BVar34 + 0x18) = 0;
      *(undefined8 *)((long)BVar34 + 0x20) = 0;
      lVar33 = (long)paVar51 - *(long *)(local_1240 + uVar65 * 0xf0 + 0x70);
      paVar60 = paVar51;
      if (lVar33 != 0) {
        uVar37 = lVar33 * 0x50;
        (**(code **)*puVar41)(puVar41,uVar37,0);
        if (uVar37 < 0x1c00000) {
          pvVar35 = alignedMalloc(uVar37,0x10);
        }
        else {
          pvVar35 = os_malloc(uVar37,(bool *)((long)BVar34 + 8));
        }
        *(void **)((long)BVar34 + 0x20) = pvVar35;
        *(long *)((long)BVar34 + 0x10) = lVar33;
        *(long *)((long)BVar34 + 0x18) = lVar33;
        paVar51 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)(local_1240 + uVar65 * 0xf0 + 0x70);
        paVar60 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)(local_1240 + lVar43 + 0x78);
      }
      uVar126 = stack0xffffffffffffe5b8;
      local_1ae0._8_8_ = (long)local_1e70.m128 + 8;
      local_1ad0 = local_1e60._0_8_;
      local_1ac8 = &local_1e30;
      uStack_1d88 = 0x7f8000007f800000;
      local_1d90 = (undefined1  [8])0x7f8000007f800000;
      local_1d80._0_8_ = 0xff800000ff800000;
      local_1d80._8_8_ = 0xff800000ff800000;
      local_1d70._0_8_ = 0x7f8000007f800000;
      local_1d70._8_8_ = 0x7f8000007f800000;
      local_1d60._0_8_ = 0xff800000ff800000;
      local_1d60._8_8_ = 0xff800000ff800000;
      local_1d50._0_8_ = 0x7f8000007f800000;
      local_1d50._8_8_ = 0x7f8000007f800000;
      local_1d40._0_8_ = 0xff800000ff800000;
      local_1d40._8_8_ = 0xff800000ff800000;
      local_1d10 = 0.0;
      local_1d20 = 0;
      sStack_1d18 = 0;
      local_1d30 = 0;
      sStack_1d28 = 0;
      fStack_1d0c = 1.0;
      fStack_1d08 = 1.0;
      fStack_1d04 = 0.0;
      local_1eb8 = BVar34;
      local_1e30 = BVar34;
      local_1ae0._0_8_ = BVar44;
      local_1ac0 = this_00;
      if ((ulong)((long)paVar60 - (long)paVar51) < 0xc00) {
        local_1a50._0_8_ = paVar51;
        unique0x1000b295 = paVar60;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  ((PrimInfoMB *)local_1e20,(anon_class_40_5_808acc65 *)&local_1ae0.field_1,
                   (range<unsigned_long> *)local_1a50);
      }
      else {
        tStack_1a44 = proxy_support;
        local_1a30._0_8_ = (intrusive_list_node *)0x0;
        local_1a30._8_8_ = (intrusive_list_node *)0x0;
        local_1a10._0_8_ = CUSTOM_CTX;
        uStack_1a42 = SUB82(uVar126,6);
        cStack_1a43 = (context_traits)0x4;
        tbb::detail::r1::initialize((task_group_context *)local_1a50);
        local_19a0 = (anon_union_8_2_d71db6ad_for_task_group_context_11)0x80;
        local_1cf0._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1cf0._8_8_ = &local_1ae0;
        local_19b0._0_8_ = paVar60;
        local_19b0._8_8_ = paVar51;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1e20,(d1 *)local_19b0,
                   (blocked_range<unsigned_long> *)local_1d90,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1cf0.field_1,
                   (anon_class_16_2_ed117de8_conflict20 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)local_1a50,in_stack_ffffffffffffe080);
        cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_1a50);
        if (cVar30 != '\0') {
          prVar42 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar42,"task cancelled");
          __cxa_throw(prVar42,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)local_1a50);
      }
      paVar51 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)(local_1240 + uVar65 * 0xf0 + 0x70);
      paVar60 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)(local_1240 + lVar43 + 0x78);
      uVar37 = (long)paVar60 - (long)paVar51;
      if (sStack_1db8 - local_1dc0 != uVar37) {
        local_1d90 = (undefined1  [8])((long)local_1e70.m128 + 8);
        sStack_1db8 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                (*(PrimRefMB **)((long)local_1e30 + 0x20),0,uVar37,0x400,
                                 (anon_class_8_1_41ce32a5 *)local_1d90);
        paVar51 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)(local_1240 + uVar65 * 0xf0 + 0x70);
        paVar60 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)(local_1240 + lVar43 + 0x78);
        uVar37 = (long)paVar60 - (long)paVar51;
      }
      uVar126 = local_19b0._8_8_;
      *(size_t *)local_1e40._0_8_ = local_1db0;
      *(size_t *)(local_1e40._0_8_ + 8) = sStack_1da8;
      local_1cb0._0_8_ = local_1e20;
      local_1cb0._8_8_ = uStack_1e18;
      local_1ca0 = local_1e10._0_8_;
      uStack_1c98 = local_1e10._8_8_;
      local_1c90 = local_1e00._0_8_;
      uStack_1c88 = local_1e00._8_8_;
      local_1c80._8_8_ = local_1df0._8_8_;
      local_1c80._0_8_ = local_1df0._0_8_;
      local_1c70 = local_1de0._0_8_;
      uStack_1c68 = local_1de0._8_8_;
      local_1c60 = local_1dd0._0_8_;
      uStack_1c58 = local_1dd0._8_8_;
      local_1c50 = local_1dc0;
      local_1c30.upper = fStack_1d9c;
      local_1c30.lower = local_1da0;
      BStack_1c28 = (BBox1f)(CONCAT44(~-(uint)(fStack_1d94 < local_1e70.m128[3]) &
                                      (uint)local_1e70.m128[3],
                                      ~-(uint)(fStack_1d98 < local_1e70.m128[2]) & (uint)fStack_1d98
                                     ) |
                            CONCAT44((uint)fStack_1d94 & -(uint)(fStack_1d94 < local_1e70.m128[3]),
                                     (uint)local_1e70.m128[2] &
                                     -(uint)(fStack_1d98 < local_1e70.m128[2])));
      local_1c20 = local_1e30;
      local_1a78.time_range1 = (BBox1f *)&local_1e70;
      local_1a78.this =
           (HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::VirtualRecalculatePrimRef,_2UL>
            *)local_1e60._0_8_;
      local_1a50._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)0x7f8000007f800000;
      stack0xffffffffffffe5b8 = (vint *)0x7f8000007f800000;
      local_1a40._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)0xff800000ff800000;
      local_1a40._8_8_ = (context_list *)0xff800000ff800000;
      local_1a30._0_8_ = (intrusive_list_node *)0x7f8000007f800000;
      local_1a30._8_8_ = (intrusive_list_node *)0x7f8000007f800000;
      local_1a20._0_8_ = (__pointer_type)0xff800000ff800000;
      local_1a20._8_8_ = (void *)0xff800000ff800000;
      local_1a10._0_8_ = 0x7f8000007f800000;
      local_1a10._8_1_ = '\0';
      local_1a10._9_1_ = '\0';
      local_1a10._10_1_ = -0x80;
      local_1a10._11_1_ = '\x7f';
      local_1a10._12_1_ = '\0';
      local_1a10._13_1_ = '\0';
      local_1a10._14_1_ = -0x80;
      local_1a10._15_1_ = '\x7f';
      local_1a00 = 0xff800000ff800000;
      uStack_19f8 = 0xff800000ff800000;
      local_19d0 = 0;
      local_19e0.lower = 0.0;
      local_19e0.upper = 0.0;
      BStack_19d8.lower = 0.0;
      BStack_19d8.upper = 0.0;
      local_19f0 = 0;
      sStack_19e8 = 0;
      local_19cc = 0x3f8000003f800000;
      local_19c4 = 0;
      sStack_1c48 = sStack_1db8;
      local_1a78.prims = (mvector<embree::PrimRefMB> *)BVar44;
      if (uVar37 < 0xc00) {
        local_19b0._0_8_ = paVar51;
        local_19b0._8_8_ = paVar60;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)local_1d90,&local_1a78,(range<unsigned_long> *)local_19b0);
      }
      else {
        local_19b0[0xc] = proxy_support;
        local_1990 = (intrusive_list_node *)0x0;
        piStack_1988 = (intrusive_list_node *)0x0;
        local_1970 = CUSTOM_CTX;
        local_19b0._14_2_ = SUB82(uVar126,6);
        local_19b0[0xd] = (context_traits)0x4;
        tbb::detail::r1::initialize((task_group_context *)local_19b0);
        local_1ce0 = 0x80;
        local_1a60._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1a60._8_8_ = &local_1a78;
        local_1cf0._0_8_ = paVar60;
        local_1cf0._8_8_ = paVar51;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1d90,
                   (d1 *)&local_1cf0.field_1,(blocked_range<unsigned_long> *)local_1a50,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1a60,
                   (anon_class_16_2_ed117de8_conflict21 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)local_19b0,in_stack_ffffffffffffe080);
        cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_19b0);
        if (cVar30 != '\0') {
          prVar42 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar42,"task cancelled");
          __cxa_throw(prVar42,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)local_19b0);
      }
      lVar33 = sStack_1d28 - local_1d30;
      local_1d30 = *(unsigned_long *)(local_1240 + uVar65 * 0xf0 + 0x70);
      sStack_1d28 = lVar33 + local_1d30;
      if (lVar33 != *(unsigned_long *)(local_1240 + lVar43 + 0x78) - local_1d30) {
        local_1a50._0_8_ = &local_1e70;
        sStack_1d28 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                                (*(PrimRefMB **)((long)BVar44 + 0x20),local_1d30,
                                 *(unsigned_long *)(local_1240 + lVar43 + 0x78),0x400,
                                 (anon_class_8_1_41ce32a6 *)local_1a50);
      }
      local_1bc0._0_8_ = local_1d90;
      local_1bc0._8_8_ = uStack_1d88;
      local_1bb0 = local_1d80._0_8_;
      uStack_1ba8 = local_1d80._8_8_;
      local_1ba0 = local_1d70._0_8_;
      uStack_1b98 = local_1d70._8_8_;
      local_1b90 = local_1d60._0_8_;
      uStack_1b88 = local_1d60._8_8_;
      local_1b80._8_8_ = local_1d50._8_8_;
      local_1b80._0_8_ = local_1d50._0_8_;
      local_1b70._8_8_ = local_1d40._8_8_;
      local_1b70._0_8_ = local_1d40._0_8_;
      auVar169._8_8_ = sStack_1d18;
      auVar169._0_8_ = local_1d20;
      *(undefined1 (*) [16])local_1e50._0_8_ = auVar169;
      local_1b40.upper = fStack_1d0c;
      local_1b40.lower = local_1d10;
      BStack_1b38 = (BBox1f)(CONCAT44(~-(uint)(fStack_1d04 < local_1e70.m128[1]) &
                                      (uint)local_1e70.m128[1],
                                      ~-(uint)(fStack_1d08 < local_1e70.m128[0]) & (uint)fStack_1d08
                                     ) |
                            CONCAT44((uint)fStack_1d04 & -(uint)(fStack_1d04 < local_1e70.m128[1]),
                                     (uint)local_1e70.m128[0] &
                                     -(uint)(fStack_1d08 < local_1e70.m128[0])));
      bVar66 = local_1eb8 != (BBox1f)0x0;
      local_1b60 = local_1d30;
      sStack_1b58 = sStack_1d28;
      local_1b30 = BVar44;
    }
    findFallback((Split *)local_1e20,this,(SetMB *)&local_1cb0.field_1);
    local_1c00 = local_1e10._0_8_;
    local_1bf0 = local_1e00._0_8_;
    uStack_1be8 = local_1e00._8_8_;
    local_1be0 = local_1df0._0_8_;
    uStack_1bd8 = local_1df0._8_8_;
    findFallback((Split *)local_1e20,this,(SetMB *)&local_1bc0.field_1);
    lVar33 = local_b8;
    local_1b10 = local_1e10._0_8_;
    local_1b00 = local_1e00._0_8_;
    uStack_1af8 = local_1e00._8_8_;
    local_1af0 = local_1df0._0_8_;
    uStack_1ae8 = local_1df0._8_8_;
    local_1eb8.lower = 0.0;
    local_1eb8.upper = 0.0;
    pBVar10 = local_340[uVar65];
    if (local_1c20 == *pBVar10) {
      pBVar10[1] = (BBox1f)((long)pBVar10[1] + 1);
      BVar44 = local_1c20;
    }
    else {
      local_b8 = local_b8 + 1;
      local_2b0[lVar33 * 2 + -1] = local_1c20;
      local_2b0[lVar33 * 2].lower = 1.4013e-45;
      local_2b0[lVar33 * 2].upper = 0.0;
      local_340[uVar65] = local_2b0 + lVar33 * 2 + -1;
      BVar44 = *pBVar10;
    }
    lVar33 = local_b8;
    if (local_1b30 == BVar44) {
      local_340[local_2c0] = pBVar10;
      BVar44 = pBVar10[1];
      pBVar10[1] = (BBox1f)((long)BVar44 + 1);
    }
    else {
      local_b8 = local_b8 + 1;
      local_2b0[lVar33 * 2 + -1] = local_1b30;
      local_2b0[lVar33 * 2].lower = 1.4013e-45;
      local_2b0[lVar33 * 2].upper = 0.0;
      local_340[local_2c0] = local_2b0 + lVar33 * 2 + -1;
      BVar44 = (BBox1f)((long)pBVar10[1] + -1);
    }
    pBVar10[1] = BVar44;
    if (BVar44 == (BBox1f)0x0) {
      BVar44 = *pBVar10;
      if (BVar44 != (BBox1f)0x0) {
        lVar33 = *(long *)((long)BVar44 + 0x18);
        pvVar35 = *(void **)((long)BVar44 + 0x20);
        if (pvVar35 != (void *)0x0) {
          if ((ulong)(lVar33 * 0x50) < 0x1c00000) {
            alignedFree(pvVar35);
          }
          else {
            os_free(pvVar35,lVar33 * 0x50,*(bool *)((long)BVar44 + 8));
          }
        }
        if (lVar33 != 0) {
          (**(code **)**(undefined8 **)BVar44)(*(undefined8 **)BVar44,lVar33 * -0x50,1);
        }
        *(undefined8 *)((long)BVar44 + 0x10) = 0;
        *(undefined8 *)((long)BVar44 + 0x18) = 0;
        *(undefined8 *)((long)BVar44 + 0x20) = 0;
      }
      operator_delete((void *)BVar44);
    }
    *(undefined8 *)(local_1240 + uVar65 * 0xf0) = local_1cc0._0_8_;
    *(undefined8 *)(local_1240 + uVar65 * 0xf0 + 0x10) = local_1cb0._0_8_;
    *(undefined8 *)(local_1240 + lVar43 + 0x18) = local_1cb0._8_8_;
    *(size_t *)(local_1240 + uVar65 * 0xf0 + 0x20) = local_1ca0;
    *(undefined8 *)(local_1240 + lVar43 + 0x28) = uStack_1c98;
    *(undefined8 *)(local_1240 + uVar65 * 0xf0 + 0x30) = local_1c90;
    *(undefined8 *)(local_1240 + lVar43 + 0x38) = uStack_1c88;
    *(undefined8 *)(local_1240 + uVar65 * 0xf0 + 0x40) = local_1c80._0_8_;
    *(undefined8 *)(local_1240 + lVar43 + 0x48) = local_1c80._8_8_;
    *(undefined8 *)(local_1240 + uVar65 * 0xf0 + 0x50) = local_1c70;
    *(undefined8 *)(local_1240 + lVar43 + 0x58) = uStack_1c68;
    *(undefined8 *)(local_1240 + uVar65 * 0xf0 + 0x60) = local_1c60;
    *(undefined8 *)(local_1240 + lVar43 + 0x68) = uStack_1c58;
    *(size_t *)(local_1240 + uVar65 * 0xf0 + 0x70) = local_1c50;
    *(size_t *)(local_1240 + lVar43 + 0x78) = sStack_1c48;
    *(size_t *)(local_1240 + lVar43 + 0x80) = local_1c40;
    (&sStack_11b8)[uVar65 * 0x1e] = sStack_1c38;
    (&local_11b0)[uVar65 * 0x1e] = local_1c30;
    local_11a0[uVar65 * 0x1e + -1] = BStack_1c28;
    local_11a0[uVar65 * 0x1e] = local_1c20;
    *(anon_class_1_0_00000001 **)&(&local_1190)[uVar65 * 0xf].field_1.x = local_1c10;
    local_1180[uVar65 * 0x1e + -1] = sStack_1c08;
    uVar37 = local_2c0;
    local_1180[uVar65 * 0x1e] = local_1c00;
    *(undefined8 *)(&local_1170 + uVar65 * 0xf) = local_1bf0;
    *(undefined8 *)((long)&local_1170 + lVar43 + 8) = uStack_1be8;
    *(undefined8 *)(&local_1160 + uVar65 * 0xf) = local_1be0;
    *(undefined8 *)((long)&local_1160 + uVar65 * 0xf0 + 8) = uStack_1bd8;
    lVar43 = local_2c0 * 0xf0;
    *(undefined8 *)(local_1240 + local_2c0 * 0xf0) = local_1bd0._0_8_;
    *(undefined8 *)(local_1240 + uVar37 * 0xf0 + 0x10) = local_1bc0._0_8_;
    *(undefined8 *)(local_1240 + lVar43 + 0x18) = local_1bc0._8_8_;
    *(undefined8 *)(local_1240 + uVar37 * 0xf0 + 0x20) = local_1bb0;
    *(undefined8 *)(local_1240 + lVar43 + 0x28) = uStack_1ba8;
    *(undefined8 *)(local_1240 + uVar37 * 0xf0 + 0x30) = local_1ba0;
    *(undefined8 *)(local_1240 + lVar43 + 0x38) = uStack_1b98;
    *(undefined8 *)(local_1240 + uVar37 * 0xf0 + 0x40) = local_1b90;
    *(undefined8 *)(local_1240 + lVar43 + 0x48) = uStack_1b88;
    *(undefined8 *)(local_1240 + uVar37 * 0xf0 + 0x50) = local_1b80._0_8_;
    *(undefined8 *)(local_1240 + lVar43 + 0x58) = local_1b80._8_8_;
    *(undefined8 *)(local_1240 + uVar37 * 0xf0 + 0x60) = local_1b70._0_8_;
    *(undefined8 *)(local_1240 + lVar43 + 0x68) = local_1b70._8_8_;
    *(unsigned_long *)(local_1240 + uVar37 * 0xf0 + 0x70) = local_1b60;
    *(size_t *)(local_1240 + lVar43 + 0x78) = sStack_1b58;
    *(undefined8 *)(local_1240 + lVar43 + 0x80) = local_1b50._0_8_;
    (&sStack_11b8)[uVar37 * 0x1e] = local_1b50._8_8_;
    (&local_11b0)[uVar37 * 0x1e] = local_1b40;
    local_11a0[uVar37 * 0x1e + -1] = BStack_1b38;
    local_11a0[uVar37 * 0x1e] = local_1b30;
    *(undefined8 *)(&local_1190 + uVar37 * 0xf) = local_1b20;
    local_1180[uVar37 * 0x1e + -1] = sStack_1b18;
    local_1180[uVar37 * 0x1e] = local_1b10;
    *(undefined8 *)(&local_1170 + uVar37 * 0xf) = local_1b00;
    *(undefined8 *)((long)&local_1170 + lVar43 + 8) = uStack_1af8;
    *(undefined8 *)(&local_1160 + uVar37 * 0xf) = local_1af0;
    *(undefined8 *)((long)&local_1160 + uVar37 * 0xf0 + 8) = uStack_1ae8;
    local_2c0 = local_2c0 + 1;
    if (local_1eb8 != (BBox1f)0x0) {
      std::
      default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
      ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                    *)&local_1eb8,
                   (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                    *)local_1eb8);
    }
    uVar37 = CONCAT71(local_1eb0._1_7_,local_1eb0[0] | bVar66);
  } while (local_2c0 < (this->cfg).branchingFactor);
  if (local_2c0 != 0) {
LAB_00c95177:
    pfVar46 = &fStack_11a4;
    uVar36 = local_2c0;
    do {
      uVar37 = (ulong)(byte)((byte)uVar37 |
                            -(*pfVar46 < *(float *)(local_1d00._0_8_ + 0x9c) ||
                             *(float *)(local_1d00._0_8_ + 0x98) < pfVar46[-1]));
      pfVar46 = pfVar46 + 0x3c;
      uVar36 = uVar36 - 1;
    } while (uVar36 != 0);
  }
LAB_00c951c1:
  if ((uVar37 & 1) == 0) {
    local_1d90 = (undefined1  [8])0xe0;
    pTVar8 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar8->alloc)._M_b._M_p) {
      local_1bd0[8] = 1;
      local_1bd0._0_8_ = pTVar8;
      MutexSys::lock(&pTVar8->mutex);
      if ((pTVar8->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar4 = &((pTVar8->alloc)._M_b._M_p)->bytesUsed;
        (paVar4->super___atomic_base<unsigned_long>)._M_i =
             (paVar4->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesUsed + (pTVar8->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar4 = &((pTVar8->alloc)._M_b._M_p)->bytesFree;
        (paVar4->super___atomic_base<unsigned_long>)._M_i =
             (paVar4->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar8->alloc0).end + (pTVar8->alloc1).end) -
             ((pTVar8->alloc0).cur + (pTVar8->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar4 = &((pTVar8->alloc)._M_b._M_p)->bytesWasted;
        (paVar4->super___atomic_base<unsigned_long>)._M_i =
             (paVar4->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesWasted + (pTVar8->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar8->alloc0).bytesUsed = 0;
      (pTVar8->alloc0).bytesWasted = 0;
      (pTVar8->alloc0).end = 0;
      (pTVar8->alloc0).allocBlockSize = 0;
      (pTVar8->alloc0).ptr = (char *)0x0;
      (pTVar8->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar8->alloc1).bytesUsed = 0;
        (pTVar8->alloc1).bytesWasted = 0;
        (pTVar8->alloc1).end = 0;
        (pTVar8->alloc1).allocBlockSize = 0;
        (pTVar8->alloc1).ptr = (char *)0x0;
        (pTVar8->alloc1).cur = 0;
      }
      else {
        (pTVar8->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar8->alloc1).ptr = (char *)0x0;
        (pTVar8->alloc1).cur = 0;
        (pTVar8->alloc1).end = 0;
        (pTVar8->alloc1).allocBlockSize = 0;
        (pTVar8->alloc1).bytesUsed = 0;
        (pTVar8->alloc1).bytesWasted = 0;
        (pTVar8->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar8->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      local_1e20 = (undefined1  [8])pTVar8;
      local_1cc0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      local_1cc0._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar11._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)local_1e20);
      }
      else {
        *iVar11._M_current = (ThreadLocal2 *)local_1e20;
        pppTVar5 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar5 = *pppTVar5 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (local_1bd0[8] == '\x01') {
        MutexSys::unlock((MutexSys *)local_1bd0._0_8_);
      }
    }
    (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)local_1d90;
    sVar40 = (alloc.talloc0)->cur;
    uVar37 = (ulong)(-(int)sVar40 & 0xf);
    uVar36 = sVar40 + (long)local_1d90 + uVar37;
    (alloc.talloc0)->cur = uVar36;
    if ((alloc.talloc0)->end < uVar36) {
      (alloc.talloc0)->cur = sVar40;
      if ((ThreadLocal2 *)(alloc.talloc0)->allocBlockSize < (ThreadLocal2 *)((long)local_1d90 << 2))
      {
        pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1d90);
      }
      else {
        local_1cc0._0_8_ = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
        pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1cc0);
        (alloc.talloc0)->ptr = pcVar49;
        sVar40 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar40;
        (alloc.talloc0)->end = local_1cc0._0_8_;
        (alloc.talloc0)->cur = (size_t)local_1d90;
        if ((ulong)local_1cc0._0_8_ < (ulong)local_1d90) {
          (alloc.talloc0)->cur = 0;
          local_1cc0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1cc0);
          (alloc.talloc0)->ptr = pcVar49;
          sVar40 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar40;
          (alloc.talloc0)->end = local_1cc0._0_8_;
          (alloc.talloc0)->cur = (size_t)local_1d90;
          if ((ulong)local_1cc0._0_8_ < (ulong)local_1d90) {
            (alloc.talloc0)->cur = 0;
            pcVar49 = (char *)0x0;
            goto LAB_00c955c5;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar40;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar37;
      pcVar49 = (alloc.talloc0)->ptr + (uVar36 - (long)local_1d90);
    }
LAB_00c955c5:
    pcVar49[0x60] = '\0';
    pcVar49[0x61] = '\0';
    pcVar49[0x62] = -0x80;
    pcVar49[99] = '\x7f';
    pcVar49[100] = '\0';
    pcVar49[0x65] = '\0';
    pcVar49[0x66] = -0x80;
    pcVar49[0x67] = '\x7f';
    pcVar49[0x68] = '\0';
    pcVar49[0x69] = '\0';
    pcVar49[0x6a] = -0x80;
    pcVar49[0x6b] = '\x7f';
    pcVar49[0x6c] = '\0';
    pcVar49[0x6d] = '\0';
    pcVar49[0x6e] = -0x80;
    pcVar49[0x6f] = '\x7f';
    pcVar49[0x40] = '\0';
    pcVar49[0x41] = '\0';
    pcVar49[0x42] = -0x80;
    pcVar49[0x43] = '\x7f';
    pcVar49[0x44] = '\0';
    pcVar49[0x45] = '\0';
    pcVar49[0x46] = -0x80;
    pcVar49[0x47] = '\x7f';
    pcVar49[0x48] = '\0';
    pcVar49[0x49] = '\0';
    pcVar49[0x4a] = -0x80;
    pcVar49[0x4b] = '\x7f';
    pcVar49[0x4c] = '\0';
    pcVar49[0x4d] = '\0';
    pcVar49[0x4e] = -0x80;
    pcVar49[0x4f] = '\x7f';
    pcVar49[0x20] = '\0';
    pcVar49[0x21] = '\0';
    pcVar49[0x22] = -0x80;
    pcVar49[0x23] = '\x7f';
    pcVar49[0x24] = '\0';
    pcVar49[0x25] = '\0';
    pcVar49[0x26] = -0x80;
    pcVar49[0x27] = '\x7f';
    pcVar49[0x28] = '\0';
    pcVar49[0x29] = '\0';
    pcVar49[0x2a] = -0x80;
    pcVar49[0x2b] = '\x7f';
    pcVar49[0x2c] = '\0';
    pcVar49[0x2d] = '\0';
    pcVar49[0x2e] = -0x80;
    pcVar49[0x2f] = '\x7f';
    pcVar49[0x70] = '\0';
    pcVar49[0x71] = '\0';
    pcVar49[0x72] = -0x80;
    pcVar49[0x73] = -1;
    pcVar49[0x74] = '\0';
    pcVar49[0x75] = '\0';
    pcVar49[0x76] = -0x80;
    pcVar49[0x77] = -1;
    pcVar49[0x78] = '\0';
    pcVar49[0x79] = '\0';
    pcVar49[0x7a] = -0x80;
    pcVar49[0x7b] = -1;
    pcVar49[0x7c] = '\0';
    pcVar49[0x7d] = '\0';
    pcVar49[0x7e] = -0x80;
    pcVar49[0x7f] = -1;
    pcVar49[0x50] = '\0';
    pcVar49[0x51] = '\0';
    pcVar49[0x52] = -0x80;
    pcVar49[0x53] = -1;
    pcVar49[0x54] = '\0';
    pcVar49[0x55] = '\0';
    pcVar49[0x56] = -0x80;
    pcVar49[0x57] = -1;
    pcVar49[0x58] = '\0';
    pcVar49[0x59] = '\0';
    pcVar49[0x5a] = -0x80;
    pcVar49[0x5b] = -1;
    pcVar49[0x5c] = '\0';
    pcVar49[0x5d] = '\0';
    pcVar49[0x5e] = -0x80;
    pcVar49[0x5f] = -1;
    pcVar49[0x30] = '\0';
    pcVar49[0x31] = '\0';
    pcVar49[0x32] = -0x80;
    pcVar49[0x33] = -1;
    pcVar49[0x34] = '\0';
    pcVar49[0x35] = '\0';
    pcVar49[0x36] = -0x80;
    pcVar49[0x37] = -1;
    pcVar49[0x38] = '\0';
    pcVar49[0x39] = '\0';
    pcVar49[0x3a] = -0x80;
    pcVar49[0x3b] = -1;
    pcVar49[0x3c] = '\0';
    pcVar49[0x3d] = '\0';
    pcVar49[0x3e] = -0x80;
    pcVar49[0x3f] = -1;
    pcVar49[0x80] = '\0';
    pcVar49[0x81] = '\0';
    pcVar49[0x82] = '\0';
    pcVar49[0x83] = '\0';
    pcVar49[0x84] = '\0';
    pcVar49[0x85] = '\0';
    pcVar49[0x86] = '\0';
    pcVar49[0x87] = '\0';
    pcVar49[0x88] = '\0';
    pcVar49[0x89] = '\0';
    pcVar49[0x8a] = '\0';
    pcVar49[0x8b] = '\0';
    pcVar49[0x8c] = '\0';
    pcVar49[0x8d] = '\0';
    pcVar49[0x8e] = '\0';
    pcVar49[0x8f] = '\0';
    pcVar49[0x90] = '\0';
    pcVar49[0x91] = '\0';
    pcVar49[0x92] = '\0';
    pcVar49[0x93] = '\0';
    pcVar49[0x94] = '\0';
    pcVar49[0x95] = '\0';
    pcVar49[0x96] = '\0';
    pcVar49[0x97] = '\0';
    pcVar49[0x98] = '\0';
    pcVar49[0x99] = '\0';
    pcVar49[0x9a] = '\0';
    pcVar49[0x9b] = '\0';
    pcVar49[0x9c] = '\0';
    pcVar49[0x9d] = '\0';
    pcVar49[0x9e] = '\0';
    pcVar49[0x9f] = '\0';
    pcVar49[0xa0] = '\0';
    pcVar49[0xa1] = '\0';
    pcVar49[0xa2] = '\0';
    pcVar49[0xa3] = '\0';
    pcVar49[0xa4] = '\0';
    pcVar49[0xa5] = '\0';
    pcVar49[0xa6] = '\0';
    pcVar49[0xa7] = '\0';
    pcVar49[0xa8] = '\0';
    pcVar49[0xa9] = '\0';
    pcVar49[0xaa] = '\0';
    pcVar49[0xab] = '\0';
    pcVar49[0xac] = '\0';
    pcVar49[0xad] = '\0';
    pcVar49[0xae] = '\0';
    pcVar49[0xaf] = '\0';
    pcVar49[0xb0] = '\0';
    pcVar49[0xb1] = '\0';
    pcVar49[0xb2] = '\0';
    pcVar49[0xb3] = '\0';
    pcVar49[0xb4] = '\0';
    pcVar49[0xb5] = '\0';
    pcVar49[0xb6] = '\0';
    pcVar49[0xb7] = '\0';
    pcVar49[0xb8] = '\0';
    pcVar49[0xb9] = '\0';
    pcVar49[0xba] = '\0';
    pcVar49[0xbb] = '\0';
    pcVar49[0xbc] = '\0';
    pcVar49[0xbd] = '\0';
    pcVar49[0xbe] = '\0';
    pcVar49[0xbf] = '\0';
    pcVar49[0xc0] = '\0';
    pcVar49[0xc1] = '\0';
    pcVar49[0xc2] = '\0';
    pcVar49[0xc3] = '\0';
    pcVar49[0xc4] = '\0';
    pcVar49[0xc5] = '\0';
    pcVar49[0xc6] = '\0';
    pcVar49[199] = '\0';
    pcVar49[200] = '\0';
    pcVar49[0xc9] = '\0';
    pcVar49[0xca] = '\0';
    pcVar49[0xcb] = '\0';
    pcVar49[0xcc] = '\0';
    pcVar49[0xcd] = '\0';
    pcVar49[0xce] = '\0';
    pcVar49[0xcf] = '\0';
    pcVar49[0xd0] = '\0';
    pcVar49[0xd1] = '\0';
    pcVar49[0xd2] = '\0';
    pcVar49[0xd3] = '\0';
    pcVar49[0xd4] = '\0';
    pcVar49[0xd5] = '\0';
    pcVar49[0xd6] = '\0';
    pcVar49[0xd7] = '\0';
    pcVar49[0xd8] = '\0';
    pcVar49[0xd9] = '\0';
    pcVar49[0xda] = '\0';
    pcVar49[0xdb] = '\0';
    pcVar49[0xdc] = '\0';
    pcVar49[0xdd] = '\0';
    pcVar49[0xde] = '\0';
    pcVar49[0xdf] = '\0';
    pcVar49[0] = '\b';
    pcVar49[1] = '\0';
    pcVar49[2] = '\0';
    pcVar49[3] = '\0';
    pcVar49[4] = '\0';
    pcVar49[5] = '\0';
    pcVar49[6] = '\0';
    pcVar49[7] = '\0';
    pcVar49[8] = '\b';
    pcVar49[9] = '\0';
    pcVar49[10] = '\0';
    pcVar49[0xb] = '\0';
    pcVar49[0xc] = '\0';
    pcVar49[0xd] = '\0';
    pcVar49[0xe] = '\0';
    pcVar49[0xf] = '\0';
    pcVar49[0x10] = '\b';
    pcVar49[0x11] = '\0';
    pcVar49[0x12] = '\0';
    pcVar49[0x13] = '\0';
    pcVar49[0x14] = '\0';
    pcVar49[0x15] = '\0';
    pcVar49[0x16] = '\0';
    pcVar49[0x17] = '\0';
    pcVar49[0x18] = '\b';
    pcVar49[0x19] = '\0';
    pcVar49[0x1a] = '\0';
    pcVar49[0x1b] = '\0';
    pcVar49[0x1c] = '\0';
    pcVar49[0x1d] = '\0';
    pcVar49[0x1e] = '\0';
    pcVar49[0x1f] = '\0';
    uVar37 = 1;
    bVar28 = false;
    goto LAB_00c9562d;
  }
  local_1d90 = (undefined1  [8])0x100;
  pTVar8 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar8->alloc)._M_b._M_p) {
    local_1bd0[8] = 1;
    local_1bd0._0_8_ = pTVar8;
    MutexSys::lock(&pTVar8->mutex);
    if ((pTVar8->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar4 = &((pTVar8->alloc)._M_b._M_p)->bytesUsed;
      (paVar4->super___atomic_base<unsigned_long>)._M_i =
           (paVar4->super___atomic_base<unsigned_long>)._M_i +
           (pTVar8->alloc1).bytesUsed + (pTVar8->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar4 = &((pTVar8->alloc)._M_b._M_p)->bytesFree;
      (paVar4->super___atomic_base<unsigned_long>)._M_i =
           (paVar4->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar8->alloc0).end + (pTVar8->alloc1).end) -
           ((pTVar8->alloc0).cur + (pTVar8->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar4 = &((pTVar8->alloc)._M_b._M_p)->bytesWasted;
      (paVar4->super___atomic_base<unsigned_long>)._M_i =
           (paVar4->super___atomic_base<unsigned_long>)._M_i +
           (pTVar8->alloc1).bytesWasted + (pTVar8->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar8->alloc0).bytesUsed = 0;
    (pTVar8->alloc0).bytesWasted = 0;
    (pTVar8->alloc0).end = 0;
    (pTVar8->alloc0).allocBlockSize = 0;
    (pTVar8->alloc0).ptr = (char *)0x0;
    (pTVar8->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar8->alloc1).bytesUsed = 0;
      (pTVar8->alloc1).bytesWasted = 0;
      (pTVar8->alloc1).end = 0;
      (pTVar8->alloc1).allocBlockSize = 0;
      (pTVar8->alloc1).ptr = (char *)0x0;
      (pTVar8->alloc1).cur = 0;
    }
    else {
      (pTVar8->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar8->alloc1).ptr = (char *)0x0;
      (pTVar8->alloc1).cur = 0;
      (pTVar8->alloc1).end = 0;
      (pTVar8->alloc1).allocBlockSize = 0;
      (pTVar8->alloc1).bytesUsed = 0;
      (pTVar8->alloc1).bytesWasted = 0;
      (pTVar8->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar8->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_1e20 = (undefined1  [8])pTVar8;
    local_1cc0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    local_1cc0._8_1_ = 1;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar11._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)local_1e20);
    }
    else {
      *iVar11._M_current = (ThreadLocal2 *)local_1e20;
      pppTVar5 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar5 = *pppTVar5 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_1bd0[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_1bd0._0_8_);
    }
  }
  (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)local_1d90;
  sVar40 = (alloc.talloc0)->cur;
  uVar37 = (ulong)(-(int)sVar40 & 0xf);
  uVar36 = sVar40 + (long)local_1d90 + uVar37;
  (alloc.talloc0)->cur = uVar36;
  if ((alloc.talloc0)->end < uVar36) {
    (alloc.talloc0)->cur = sVar40;
    if ((ThreadLocal2 *)(alloc.talloc0)->allocBlockSize < (ThreadLocal2 *)((long)local_1d90 << 2)) {
      pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1d90);
    }
    else {
      local_1cc0._0_8_ = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
      pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1cc0);
      (alloc.talloc0)->ptr = pcVar49;
      sVar40 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar40;
      (alloc.talloc0)->end = local_1cc0._0_8_;
      (alloc.talloc0)->cur = (size_t)local_1d90;
      if ((ulong)local_1cc0._0_8_ < (ulong)local_1d90) {
        (alloc.talloc0)->cur = 0;
        local_1cc0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar49 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1cc0);
        (alloc.talloc0)->ptr = pcVar49;
        sVar40 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar40;
        (alloc.talloc0)->end = local_1cc0._0_8_;
        (alloc.talloc0)->cur = (size_t)local_1d90;
        if ((ulong)local_1cc0._0_8_ < (ulong)local_1d90) {
          (alloc.talloc0)->cur = 0;
          pcVar49 = (char *)0x0;
          goto LAB_00c954cd;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar40;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar37;
    pcVar49 = (alloc.talloc0)->ptr + (uVar36 - (long)local_1d90);
  }
LAB_00c954cd:
  pcVar49[0xe0] = '\0';
  pcVar49[0xe1] = '\0';
  pcVar49[0xe2] = -0x80;
  pcVar49[0xe3] = '\x7f';
  pcVar49[0xe4] = '\0';
  pcVar49[0xe5] = '\0';
  pcVar49[0xe6] = -0x80;
  pcVar49[0xe7] = '\x7f';
  pcVar49[0xe8] = '\0';
  pcVar49[0xe9] = '\0';
  pcVar49[0xea] = -0x80;
  pcVar49[0xeb] = '\x7f';
  pcVar49[0xec] = '\0';
  pcVar49[0xed] = '\0';
  pcVar49[0xee] = -0x80;
  pcVar49[0xef] = '\x7f';
  pcVar49[0xf0] = '\0';
  pcVar49[0xf1] = '\0';
  pcVar49[0xf2] = -0x80;
  pcVar49[0xf3] = -1;
  pcVar49[0xf4] = '\0';
  pcVar49[0xf5] = '\0';
  pcVar49[0xf6] = -0x80;
  pcVar49[0xf7] = -1;
  pcVar49[0xf8] = '\0';
  pcVar49[0xf9] = '\0';
  pcVar49[0xfa] = -0x80;
  pcVar49[0xfb] = -1;
  pcVar49[0xfc] = '\0';
  pcVar49[0xfd] = '\0';
  pcVar49[0xfe] = -0x80;
  pcVar49[0xff] = -1;
  pcVar49[0x60] = '\0';
  pcVar49[0x61] = '\0';
  pcVar49[0x62] = -0x80;
  pcVar49[99] = '\x7f';
  pcVar49[100] = '\0';
  pcVar49[0x65] = '\0';
  pcVar49[0x66] = -0x80;
  pcVar49[0x67] = '\x7f';
  pcVar49[0x68] = '\0';
  pcVar49[0x69] = '\0';
  pcVar49[0x6a] = -0x80;
  pcVar49[0x6b] = '\x7f';
  pcVar49[0x6c] = '\0';
  pcVar49[0x6d] = '\0';
  pcVar49[0x6e] = -0x80;
  pcVar49[0x6f] = '\x7f';
  pcVar49[0x40] = '\0';
  pcVar49[0x41] = '\0';
  pcVar49[0x42] = -0x80;
  pcVar49[0x43] = '\x7f';
  pcVar49[0x44] = '\0';
  pcVar49[0x45] = '\0';
  pcVar49[0x46] = -0x80;
  pcVar49[0x47] = '\x7f';
  pcVar49[0x48] = '\0';
  pcVar49[0x49] = '\0';
  pcVar49[0x4a] = -0x80;
  pcVar49[0x4b] = '\x7f';
  pcVar49[0x4c] = '\0';
  pcVar49[0x4d] = '\0';
  pcVar49[0x4e] = -0x80;
  pcVar49[0x4f] = '\x7f';
  pcVar49[0x20] = '\0';
  pcVar49[0x21] = '\0';
  pcVar49[0x22] = -0x80;
  pcVar49[0x23] = '\x7f';
  pcVar49[0x24] = '\0';
  pcVar49[0x25] = '\0';
  pcVar49[0x26] = -0x80;
  pcVar49[0x27] = '\x7f';
  pcVar49[0x28] = '\0';
  pcVar49[0x29] = '\0';
  pcVar49[0x2a] = -0x80;
  pcVar49[0x2b] = '\x7f';
  pcVar49[0x2c] = '\0';
  pcVar49[0x2d] = '\0';
  pcVar49[0x2e] = -0x80;
  pcVar49[0x2f] = '\x7f';
  pcVar49[0x70] = '\0';
  pcVar49[0x71] = '\0';
  pcVar49[0x72] = -0x80;
  pcVar49[0x73] = -1;
  pcVar49[0x74] = '\0';
  pcVar49[0x75] = '\0';
  pcVar49[0x76] = -0x80;
  pcVar49[0x77] = -1;
  pcVar49[0x78] = '\0';
  pcVar49[0x79] = '\0';
  pcVar49[0x7a] = -0x80;
  pcVar49[0x7b] = -1;
  pcVar49[0x7c] = '\0';
  pcVar49[0x7d] = '\0';
  pcVar49[0x7e] = -0x80;
  pcVar49[0x7f] = -1;
  pcVar49[0x50] = '\0';
  pcVar49[0x51] = '\0';
  pcVar49[0x52] = -0x80;
  pcVar49[0x53] = -1;
  pcVar49[0x54] = '\0';
  pcVar49[0x55] = '\0';
  pcVar49[0x56] = -0x80;
  pcVar49[0x57] = -1;
  pcVar49[0x58] = '\0';
  pcVar49[0x59] = '\0';
  pcVar49[0x5a] = -0x80;
  pcVar49[0x5b] = -1;
  pcVar49[0x5c] = '\0';
  pcVar49[0x5d] = '\0';
  pcVar49[0x5e] = -0x80;
  pcVar49[0x5f] = -1;
  pcVar49[0x30] = '\0';
  pcVar49[0x31] = '\0';
  pcVar49[0x32] = -0x80;
  pcVar49[0x33] = -1;
  pcVar49[0x34] = '\0';
  pcVar49[0x35] = '\0';
  pcVar49[0x36] = -0x80;
  pcVar49[0x37] = -1;
  pcVar49[0x38] = '\0';
  pcVar49[0x39] = '\0';
  pcVar49[0x3a] = -0x80;
  pcVar49[0x3b] = -1;
  pcVar49[0x3c] = '\0';
  pcVar49[0x3d] = '\0';
  pcVar49[0x3e] = -0x80;
  pcVar49[0x3f] = -1;
  pcVar49[0x80] = '\0';
  pcVar49[0x81] = '\0';
  pcVar49[0x82] = '\0';
  pcVar49[0x83] = '\0';
  pcVar49[0x84] = '\0';
  pcVar49[0x85] = '\0';
  pcVar49[0x86] = '\0';
  pcVar49[0x87] = '\0';
  pcVar49[0x88] = '\0';
  pcVar49[0x89] = '\0';
  pcVar49[0x8a] = '\0';
  pcVar49[0x8b] = '\0';
  pcVar49[0x8c] = '\0';
  pcVar49[0x8d] = '\0';
  pcVar49[0x8e] = '\0';
  pcVar49[0x8f] = '\0';
  pcVar49[0x90] = '\0';
  pcVar49[0x91] = '\0';
  pcVar49[0x92] = '\0';
  pcVar49[0x93] = '\0';
  pcVar49[0x94] = '\0';
  pcVar49[0x95] = '\0';
  pcVar49[0x96] = '\0';
  pcVar49[0x97] = '\0';
  pcVar49[0x98] = '\0';
  pcVar49[0x99] = '\0';
  pcVar49[0x9a] = '\0';
  pcVar49[0x9b] = '\0';
  pcVar49[0x9c] = '\0';
  pcVar49[0x9d] = '\0';
  pcVar49[0x9e] = '\0';
  pcVar49[0x9f] = '\0';
  pcVar49[0xa0] = '\0';
  pcVar49[0xa1] = '\0';
  pcVar49[0xa2] = '\0';
  pcVar49[0xa3] = '\0';
  pcVar49[0xa4] = '\0';
  pcVar49[0xa5] = '\0';
  pcVar49[0xa6] = '\0';
  pcVar49[0xa7] = '\0';
  pcVar49[0xa8] = '\0';
  pcVar49[0xa9] = '\0';
  pcVar49[0xaa] = '\0';
  pcVar49[0xab] = '\0';
  pcVar49[0xac] = '\0';
  pcVar49[0xad] = '\0';
  pcVar49[0xae] = '\0';
  pcVar49[0xaf] = '\0';
  pcVar49[0xb0] = '\0';
  pcVar49[0xb1] = '\0';
  pcVar49[0xb2] = '\0';
  pcVar49[0xb3] = '\0';
  pcVar49[0xb4] = '\0';
  pcVar49[0xb5] = '\0';
  pcVar49[0xb6] = '\0';
  pcVar49[0xb7] = '\0';
  pcVar49[0xb8] = '\0';
  pcVar49[0xb9] = '\0';
  pcVar49[0xba] = '\0';
  pcVar49[0xbb] = '\0';
  pcVar49[0xbc] = '\0';
  pcVar49[0xbd] = '\0';
  pcVar49[0xbe] = '\0';
  pcVar49[0xbf] = '\0';
  pcVar49[0xc0] = '\0';
  pcVar49[0xc1] = '\0';
  pcVar49[0xc2] = '\0';
  pcVar49[0xc3] = '\0';
  pcVar49[0xc4] = '\0';
  pcVar49[0xc5] = '\0';
  pcVar49[0xc6] = '\0';
  pcVar49[199] = '\0';
  pcVar49[200] = '\0';
  pcVar49[0xc9] = '\0';
  pcVar49[0xca] = '\0';
  pcVar49[0xcb] = '\0';
  pcVar49[0xcc] = '\0';
  pcVar49[0xcd] = '\0';
  pcVar49[0xce] = '\0';
  pcVar49[0xcf] = '\0';
  pcVar49[0xd0] = '\0';
  pcVar49[0xd1] = '\0';
  pcVar49[0xd2] = '\0';
  pcVar49[0xd3] = '\0';
  pcVar49[0xd4] = '\0';
  pcVar49[0xd5] = '\0';
  pcVar49[0xd6] = '\0';
  pcVar49[0xd7] = '\0';
  pcVar49[0xd8] = '\0';
  pcVar49[0xd9] = '\0';
  pcVar49[0xda] = '\0';
  pcVar49[0xdb] = '\0';
  pcVar49[0xdc] = '\0';
  pcVar49[0xdd] = '\0';
  pcVar49[0xde] = '\0';
  pcVar49[0xdf] = '\0';
  pcVar49[0] = '\b';
  pcVar49[1] = '\0';
  pcVar49[2] = '\0';
  pcVar49[3] = '\0';
  pcVar49[4] = '\0';
  pcVar49[5] = '\0';
  pcVar49[6] = '\0';
  pcVar49[7] = '\0';
  pcVar49[8] = '\b';
  pcVar49[9] = '\0';
  pcVar49[10] = '\0';
  pcVar49[0xb] = '\0';
  pcVar49[0xc] = '\0';
  pcVar49[0xd] = '\0';
  pcVar49[0xe] = '\0';
  pcVar49[0xf] = '\0';
  pcVar49[0x10] = '\b';
  pcVar49[0x11] = '\0';
  pcVar49[0x12] = '\0';
  pcVar49[0x13] = '\0';
  pcVar49[0x14] = '\0';
  pcVar49[0x15] = '\0';
  pcVar49[0x16] = '\0';
  pcVar49[0x17] = '\0';
  pcVar49[0x18] = '\b';
  pcVar49[0x19] = '\0';
  pcVar49[0x1a] = '\0';
  pcVar49[0x1b] = '\0';
  pcVar49[0x1c] = '\0';
  pcVar49[0x1d] = '\0';
  pcVar49[0x1e] = '\0';
  pcVar49[0x1f] = '\0';
  bVar28 = true;
  uVar37 = 6;
LAB_00c9562d:
  local_1f20._8_8_ = 0x7f8000007f800000;
  local_1f20._0_8_ = 0x7f8000007f800000;
  uVar37 = uVar37 | (ulong)pcVar49;
  local_1ed0 = (uint)uVar37;
  local_1f60._8_8_ = 0xff800000ff800000;
  local_1f60._0_8_ = 0xff800000ff800000;
  if (local_2c0 != 0) {
    puVar41 = (undefined8 *)local_17f0;
    uVar36 = 0;
    local_1f10._8_8_ = 0x7f8000007f800000;
    local_1f10._0_8_ = 0x7f8000007f800000;
    local_1f20._8_8_ = 0x7f8000007f800000;
    local_1f20._0_8_ = 0x7f8000007f800000;
    local_1f70._8_8_ = 0xff800000ff800000;
    local_1f70._0_8_ = 0xff800000ff800000;
    local_1f60._8_8_ = 0xff800000ff800000;
    local_1f60._0_8_ = 0xff800000ff800000;
    in_00 = (BuildRecord *)local_1240;
    do {
      createLargeLeaf((NodeRecordMB4D *)&local_1cc0.field_1,this,in_00,alloc);
      auVar169 = _DAT_01f80810;
      auVar78 = _DAT_01f80800;
      puVar41[-10] = local_1cc0._0_8_;
      auVar156._8_8_ = local_1cb0._8_8_;
      auVar156._0_8_ = local_1cb0._0_8_;
      *(undefined1 (*) [16])(puVar41 + -8) = auVar156;
      auVar161._8_8_ = uStack_1c98;
      auVar161._0_8_ = local_1ca0;
      *(undefined1 (*) [16])(puVar41 + -6) = auVar161;
      auVar167._8_8_ = uStack_1c88;
      auVar167._0_8_ = local_1c90;
      *(undefined1 (*) [16])(puVar41 + -4) = auVar167;
      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(puVar41 + -2) = local_1c80;
      *puVar41 = local_1c70;
      local_1f10 = minps(local_1f10,auVar156);
      local_1f70 = maxps(local_1f70,auVar161);
      local_1f20 = minps(local_1f20,auVar167);
      local_1f60 = maxps(local_1f60,(undefined1  [16])local_1c80);
      uVar36 = uVar36 + 1;
      puVar41 = puVar41 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (uVar36 < local_2c0);
    if ((local_1ed0 & 0xf) == 1) {
      if (local_2c0 != 0) {
        uVar65 = (ulong)pcVar49 & 0xfffffffffffffff0;
        pfVar46 = (float *)(local_17f0 + 4);
        uVar36 = 0;
        do {
          *(undefined8 *)(uVar65 + uVar36 * 8) = *(undefined8 *)(pfVar46 + -0x15);
          fVar172 = pfVar46[-1];
          fVar171 = 1.0 / (*pfVar46 - fVar172);
          fVar177 = -fVar172 * fVar171;
          fVar165 = 1.0 - fVar177;
          auVar160._0_4_ = pfVar46[-0x11] * fVar165 + pfVar46[-9] * fVar177;
          auVar160._4_4_ = pfVar46[-0x10] * fVar165 + pfVar46[-8] * fVar177;
          auVar160._8_4_ = pfVar46[-0xf] * fVar165 + pfVar46[-7] * fVar177;
          auVar160._12_4_ = pfVar46[-0xe] * fVar165 + pfVar46[-6] * fVar177;
          auVar166._0_4_ = fVar165 * pfVar46[-0xd] + fVar177 * pfVar46[-5];
          auVar166._4_4_ = fVar165 * pfVar46[-0xc] + fVar177 * pfVar46[-4];
          auVar166._8_4_ = fVar165 * pfVar46[-0xb] + fVar177 * pfVar46[-3];
          auVar166._12_4_ = fVar165 * pfVar46[-10] + fVar177 * pfVar46[-2];
          fVar171 = (1.0 - fVar172) * fVar171;
          fVar172 = 1.0 - fVar171;
          auVar155._0_4_ = pfVar46[-0x11] * fVar172 + pfVar46[-9] * fVar171;
          auVar155._4_4_ = pfVar46[-0x10] * fVar172 + pfVar46[-8] * fVar171;
          auVar155._8_4_ = pfVar46[-0xf] * fVar172 + pfVar46[-7] * fVar171;
          auVar155._12_4_ = pfVar46[-0xe] * fVar172 + pfVar46[-6] * fVar171;
          auVar173._0_4_ = fVar172 * pfVar46[-0xd] + fVar171 * pfVar46[-5];
          auVar173._4_4_ = fVar172 * pfVar46[-0xc] + fVar171 * pfVar46[-4];
          auVar173._8_4_ = fVar172 * pfVar46[-0xb] + fVar171 * pfVar46[-3];
          auVar173._12_4_ = fVar172 * pfVar46[-10] + fVar171 * pfVar46[-2];
          auVar161 = minps(auVar160,auVar169);
          auVar167 = maxps(auVar166,auVar78);
          auVar156 = minps(auVar155,auVar169);
          auVar174 = maxps(auVar173,auVar78);
          fVar172 = auVar161._0_4_ - ABS(auVar161._0_4_) * 4.7683716e-07;
          fVar165 = auVar161._4_4_ - ABS(auVar161._4_4_) * 4.7683716e-07;
          fVar171 = auVar161._8_4_ - ABS(auVar161._8_4_) * 4.7683716e-07;
          fVar177 = ABS(auVar167._0_4_) * 4.7683716e-07 + auVar167._0_4_;
          fVar175 = ABS(auVar167._4_4_) * 4.7683716e-07 + auVar167._4_4_;
          fVar176 = ABS(auVar167._8_4_) * 4.7683716e-07 + auVar167._8_4_;
          *(float *)(uVar65 + 0x20 + uVar36 * 4) = fVar172;
          *(float *)(uVar65 + 0x40 + uVar36 * 4) = fVar165;
          *(float *)(uVar65 + 0x60 + uVar36 * 4) = fVar171;
          *(float *)(uVar65 + 0x30 + uVar36 * 4) = fVar177;
          *(float *)(uVar65 + 0x50 + uVar36 * 4) = fVar175;
          *(float *)(uVar65 + 0x70 + uVar36 * 4) = fVar176;
          *(float *)(uVar65 + 0x80 + uVar36 * 4) =
               (auVar156._0_4_ - ABS(auVar156._0_4_) * 4.7683716e-07) - fVar172;
          *(float *)(uVar65 + 0xa0 + uVar36 * 4) =
               (auVar156._4_4_ - ABS(auVar156._4_4_) * 4.7683716e-07) - fVar165;
          *(float *)(uVar65 + 0xc0 + uVar36 * 4) =
               (auVar156._8_4_ - ABS(auVar156._8_4_) * 4.7683716e-07) - fVar171;
          *(float *)(uVar65 + 0x90 + uVar36 * 4) =
               (ABS(auVar174._0_4_) * 4.7683716e-07 + auVar174._0_4_) - fVar177;
          *(float *)(uVar65 + 0xb0 + uVar36 * 4) =
               (ABS(auVar174._4_4_) * 4.7683716e-07 + auVar174._4_4_) - fVar175;
          *(float *)(uVar65 + 0xd0 + uVar36 * 4) =
               (ABS(auVar174._8_4_) * 4.7683716e-07 + auVar174._8_4_) - fVar176;
          uVar36 = uVar36 + 1;
          pfVar46 = pfVar46 + 0x18;
        } while (local_2c0 != uVar36);
      }
    }
    else if (local_2c0 != 0) {
      uVar65 = (ulong)pcVar49 & 0xfffffffffffffff0;
      pfVar46 = (float *)(local_17f0 + 4);
      uVar36 = 0;
      do {
        *(undefined8 *)(uVar65 + uVar36 * 8) = *(undefined8 *)(pfVar46 + -0x15);
        fVar172 = *pfVar46;
        fVar165 = pfVar46[-1];
        fVar177 = 1.0 / (fVar172 - fVar165);
        fVar175 = -fVar165 * fVar177;
        fVar171 = 1.0 - fVar175;
        auVar178._0_4_ = pfVar46[-0x11] * fVar171 + pfVar46[-9] * fVar175;
        auVar178._4_4_ = pfVar46[-0x10] * fVar171 + pfVar46[-8] * fVar175;
        auVar178._8_4_ = pfVar46[-0xf] * fVar171 + pfVar46[-7] * fVar175;
        auVar178._12_4_ = pfVar46[-0xe] * fVar171 + pfVar46[-6] * fVar175;
        auVar181._0_4_ = fVar171 * pfVar46[-0xd] + fVar175 * pfVar46[-5];
        auVar181._4_4_ = fVar171 * pfVar46[-0xc] + fVar175 * pfVar46[-4];
        auVar181._8_4_ = fVar171 * pfVar46[-0xb] + fVar175 * pfVar46[-3];
        auVar181._12_4_ = fVar171 * pfVar46[-10] + fVar175 * pfVar46[-2];
        fVar177 = (1.0 - fVar165) * fVar177;
        fVar171 = 1.0 - fVar177;
        auVar174._0_4_ = pfVar46[-0x11] * fVar171 + pfVar46[-9] * fVar177;
        auVar174._4_4_ = pfVar46[-0x10] * fVar171 + pfVar46[-8] * fVar177;
        auVar174._8_4_ = pfVar46[-0xf] * fVar171 + pfVar46[-7] * fVar177;
        auVar174._12_4_ = pfVar46[-0xe] * fVar171 + pfVar46[-6] * fVar177;
        auVar182._0_4_ = fVar171 * pfVar46[-0xd] + fVar177 * pfVar46[-5];
        auVar182._4_4_ = fVar171 * pfVar46[-0xc] + fVar177 * pfVar46[-4];
        auVar182._8_4_ = fVar171 * pfVar46[-0xb] + fVar177 * pfVar46[-3];
        auVar182._12_4_ = fVar171 * pfVar46[-10] + fVar177 * pfVar46[-2];
        auVar156 = minps(auVar178,_DAT_01f80810);
        auVar161 = maxps(auVar181,auVar78);
        auVar169 = minps(auVar174,_DAT_01f80810);
        auVar167 = maxps(auVar182,auVar78);
        fVar176 = auVar156._0_4_ - ABS(auVar156._0_4_) * 4.7683716e-07;
        fVar179 = auVar156._4_4_ - ABS(auVar156._4_4_) * 4.7683716e-07;
        fVar180 = auVar156._8_4_ - ABS(auVar156._8_4_) * 4.7683716e-07;
        fVar171 = ABS(auVar161._0_4_) * 4.7683716e-07 + auVar161._0_4_;
        fVar177 = ABS(auVar161._4_4_) * 4.7683716e-07 + auVar161._4_4_;
        fVar175 = ABS(auVar161._8_4_) * 4.7683716e-07 + auVar161._8_4_;
        *(float *)(uVar65 + 0x20 + uVar36 * 4) = fVar176;
        *(float *)(uVar65 + 0x40 + uVar36 * 4) = fVar179;
        *(float *)(uVar65 + 0x60 + uVar36 * 4) = fVar180;
        *(float *)(uVar65 + 0x30 + uVar36 * 4) = fVar171;
        *(float *)(uVar65 + 0x50 + uVar36 * 4) = fVar177;
        *(float *)(uVar65 + 0x70 + uVar36 * 4) = fVar175;
        *(float *)(uVar65 + 0x80 + uVar36 * 4) =
             (auVar169._0_4_ - ABS(auVar169._0_4_) * 4.7683716e-07) - fVar176;
        *(float *)(uVar65 + 0xa0 + uVar36 * 4) =
             (auVar169._4_4_ - ABS(auVar169._4_4_) * 4.7683716e-07) - fVar179;
        *(float *)(uVar65 + 0xc0 + uVar36 * 4) =
             (auVar169._8_4_ - ABS(auVar169._8_4_) * 4.7683716e-07) - fVar180;
        *(float *)(uVar65 + 0x90 + uVar36 * 4) =
             (ABS(auVar167._0_4_) * 4.7683716e-07 + auVar167._0_4_) - fVar171;
        *(float *)(uVar65 + 0xb0 + uVar36 * 4) =
             (ABS(auVar167._4_4_) * 4.7683716e-07 + auVar167._4_4_) - fVar177;
        *(float *)(uVar65 + 0xd0 + uVar36 * 4) =
             (ABS(auVar167._8_4_) * 4.7683716e-07 + auVar167._8_4_) - fVar175;
        *(float *)(uVar65 + 0xe0 + uVar36 * 4) = fVar165;
        *(uint *)(uVar65 + 0xf0 + uVar36 * 4) =
             ~-(uint)(fVar172 == 1.0) & (uint)fVar172 | -(uint)(fVar172 == 1.0) & 0x3f800001;
        uVar36 = uVar36 + 1;
        pfVar46 = pfVar46 + 0x18;
      } while (local_2c0 != uVar36);
    }
  }
  pTVar9 = pTStack_18b8;
  pTVar8 = local_18c0;
  if (bVar28) {
    local_19b0._8_8_ = &this->recalculatePrimRef;
    local_19b0._0_8_ = &local_1920;
    local_1bd0._0_8_ = (ThreadLocal2 *)0x7f8000007f800000;
    local_1bd0._8_8_ = 0x7f8000007f800000;
    local_1bc0._0_8_ = 0xff800000ff800000;
    local_1bc0._8_8_ = 0xff800000ff800000;
    local_1bb0 = 0x7f8000007f800000;
    uStack_1ba8 = 0x7f8000007f800000;
    local_1ba0 = 0xff800000ff800000;
    uStack_1b98 = 0xff800000ff800000;
    if ((ulong)((long)pTStack_18b8 - (long)local_18c0) < 0xc00) {
      local_1cc0._0_8_ = local_18c0;
      local_1cc0._8_8_ = pTStack_18b8;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)local_1e20,(anon_class_16_2_aeee9775 *)local_19b0,
                 (range<unsigned_long> *)&local_1cc0.field_1);
    }
    else {
      local_1cc0._12_2_ = 0x401;
      local_1ca0 = 0;
      uStack_1c98 = 0;
      local_1c80._0_8_ = 8;
      tbb::detail::r1::initialize((task_group_context *)&local_1cc0.field_1);
      uStack_1d88 = pTVar8;
      local_1d90 = (undefined1  [8])pTVar9;
      local_1d80._0_8_ = 0x400;
      local_1a50._0_8_ = &local_1ae0;
      unique0x00005300 = local_19b0;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::GridRecalculatePrimRef>(embree::sse2::GridRecalculatePrimRef_const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::GridRecalculatePrimRef>(embree::sse2::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::GridRecalculatePrimRef>(embree::sse2::GridRecalculatePrimRef_const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::GridRecalculatePrimRef>(embree::sse2::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::GridRecalculatePrimRef>(embree::sse2::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)local_1e20,(d1 *)local_1d90,
                 (blocked_range<unsigned_long> *)local_1bd0,(LBBox<embree::Vec3fa> *)local_1a50,
                 (anon_class_16_2_ed117de8_conflict22 *)local_1a50._0_8_,
                 (anon_class_1_0_00000001 *)&local_1cc0.field_1,in_stack_ffffffffffffe080);
      cVar30 = tbb::detail::r1::is_group_execution_cancelled
                         ((task_group_context *)&local_1cc0.field_1);
      if (cVar30 != '\0') {
        prVar42 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar42,"task cancelled");
        __cxa_throw(prVar42,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&local_1cc0.field_1);
    }
    (local_1e88->ref).ptr = uVar37;
    *(undefined1 (*) [8])&(local_1e88->lbounds).bounds0.lower.field_0 = local_1e20;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds0.lower.field_0 + 8) = uStack_1e18;
    *(undefined8 *)&(local_1e88->lbounds).bounds0.upper.field_0 = local_1e10._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds0.upper.field_0 + 8) = local_1e10._8_8_;
    *(undefined8 *)&(local_1e88->lbounds).bounds1.lower.field_0 = local_1e00._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds1.lower.field_0 + 8) = local_1e00._8_8_;
    local_1f60._0_8_ = local_1df0._0_8_;
    local_1f60._8_8_ = local_1df0._8_8_;
  }
  else {
    (local_1e88->ref).ptr = uVar37;
    *(undefined8 *)&(local_1e88->lbounds).bounds0.lower.field_0 = local_1f10._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds0.lower.field_0 + 8) = local_1f10._8_8_;
    *(undefined8 *)&(local_1e88->lbounds).bounds0.upper.field_0 = local_1f70._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds0.upper.field_0 + 8) = local_1f70._8_8_;
    *(undefined8 *)&(local_1e88->lbounds).bounds1.lower.field_0 = local_1f20._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds1.lower.field_0 + 8) = local_1f20._8_8_;
  }
  *(undefined8 *)&(local_1e88->lbounds).bounds1.upper.field_0 = local_1f60._0_8_;
  *(undefined8 *)((long)&(local_1e88->lbounds).bounds1.upper.field_0 + 8) = local_1f60._8_8_;
  local_1e88->dt = BStack_1898;
  if (local_2c0 == 0) {
    return local_1e88;
  }
  uVar37 = 0;
  do {
    pBVar12 = local_340[uVar37];
    pBVar10 = pBVar12 + 1;
    *pBVar10 = (BBox1f)((long)*pBVar10 + -1);
    if (*pBVar10 == (BBox1f)0x0) {
      BVar44 = *pBVar12;
      if (BVar44 != (BBox1f)0x0) {
        lVar43 = *(undefined8 *)((long)BVar44 + 0x18);
        pvVar35 = *(void **)((long)BVar44 + 0x20);
        if (pvVar35 != (void *)0x0) {
          if ((ulong)(lVar43 * 0x50) < 0x1c00000) {
            alignedFree(pvVar35);
          }
          else {
            os_free(pvVar35,lVar43 * 0x50,*(bool *)((long)BVar44 + 8));
          }
        }
        if (lVar43 != 0) {
          (**(code **)**(undefined8 **)BVar44)(*(undefined8 **)BVar44,lVar43 * -0x50,1);
        }
        *(undefined8 *)((long)BVar44 + 0x10) = 0;
        *(undefined8 *)((long)BVar44 + 0x18) = 0;
        *(undefined8 *)((long)BVar44 + 0x20) = 0;
      }
      operator_delete((void *)BVar44);
    }
    uVar37 = uVar37 + 1;
  } while (uVar37 < local_2c0);
  return local_1e88;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }